

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86_avx512::forward
          (InnerProduct_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  float fVar8;
  _func_int *p_Var9;
  int *piVar10;
  long lVar11;
  void *pvVar12;
  float *pfVar13;
  bool bVar14;
  byte bVar15;
  ulong uVar16;
  ulong uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  byte bVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined4 uVar84;
  undefined4 uVar85;
  undefined4 uVar86;
  undefined4 uVar87;
  float afVar88 [16];
  float afVar89 [16];
  float afVar90 [16];
  float afVar91 [16];
  float afVar92 [16];
  float afVar93 [16];
  float afVar94 [16];
  float afVar95 [16];
  float afVar96 [16];
  float afVar97 [16];
  float afVar98 [16];
  float afVar99 [16];
  int p;
  int iVar100;
  uint uVar101;
  ulong uVar102;
  ulong uVar103;
  undefined1 (*pauVar104) [32];
  void *pvVar105;
  long lVar106;
  long lVar107;
  long lVar108;
  undefined1 (*pauVar109) [64];
  undefined1 (*pauVar110) [32];
  undefined1 (*pauVar111) [32];
  long lVar112;
  int iVar113;
  uint uVar114;
  long lVar115;
  long lVar116;
  uint uVar117;
  uint uVar118;
  long lVar119;
  long lVar120;
  uint uVar121;
  ushort uVar122;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [28];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  float fVar199;
  float fVar200;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  v4sf one_4;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar224;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  v4sf one;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 in_ZMM16 [64];
  undefined1 auVar267 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar268 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar269 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar270 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar271 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar272 [64];
  undefined1 in_ZMM30 [64];
  Option opt_flatten;
  uint local_138;
  undefined1 (*local_128) [32];
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  int local_110;
  Allocator *local_108;
  int local_100;
  int iStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  size_t local_e8;
  InnerProduct_x86_avx512 *local_d8;
  ulong local_d0;
  Mat *local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [48];
  
  auVar125 = in_ZMM30._0_16_;
  auVar123 = in_ZMM29._0_16_;
  if ((opt->use_int8_inference == true) &&
     (*(int *)(&this->field_0xdc + (long)this->_vptr_InnerProduct_x86_avx512[-3]) != 0)) {
    iVar100 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar100;
  }
  iVar100 = cpu_support_x86_f16c();
  if ((iVar100 != 0) && (opt->use_fp16_storage == true)) {
    iVar100 = forward_fp16s(this,bottom_blob,top_blob,opt);
    return iVar100;
  }
  local_100 = bottom_blob->dims;
  if ((local_100 == 2) &&
     (bottom_blob->w ==
      *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86_avx512[-3]) /
      *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3]))) {
    Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3])
                ,bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    p_Var9 = this->_vptr_InnerProduct_x86_avx512[-3];
    innerproduct_gemm_sse
              (bottom_blob,top_blob,&this->weight_data_tm,(Mat *)(&this->field_0x178 + (long)p_Var9)
               ,*(int *)(&this->field_0xe0 + (long)p_Var9),(Mat *)(&this->field_0xe8 + (long)p_Var9)
               ,opt);
    return 0;
  }
  piVar10 = bottom_blob->refcount;
  local_128 = (undefined1 (*) [32])bottom_blob->data;
  uStack_120 = SUB84(bottom_blob->refcount,0);
  uStack_11c = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_118 = (undefined4)bottom_blob->elemsize;
  uStack_114 = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_110 = bottom_blob->elempack;
  local_108 = bottom_blob->allocator;
  uVar84 = bottom_blob->w;
  uVar85 = bottom_blob->h;
  uVar86 = bottom_blob->d;
  uVar87 = bottom_blob->c;
  local_e8 = bottom_blob->cstep;
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + 1;
    UNLOCK();
  }
  iStack_fc = uVar84;
  uStack_f8 = uVar85;
  uStack_f4 = uVar86;
  uStack_f0 = uVar87;
  if (bottom_blob->dims != 1) {
    auStack_68 = SUB6448(*opt,0x10);
    local_78 = SUB648(*opt,0);
    pAStack_70 = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_128);
  }
  uVar101 = 1;
  if (opt->use_packing_layout == true) {
    uVar101 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3]);
    if ((uVar101 & 0xf) == 0) {
      uVar101 = 0x10;
    }
    else if ((uVar101 & 7) == 0) {
      uVar101 = 8;
    }
    else {
      uVar101 = (uint)((uVar101 & 3) == 0) * 3 + 1;
    }
  }
  Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3]) /
                       (int)uVar101,
              (ulong)uVar101 * (CONCAT44(uStack_114,local_118) / (ulong)(long)local_110),uVar101,
              opt->blob_allocator);
  pauVar111 = local_128;
  afVar99 = _ps512_cephes_log_q2;
  afVar98 = _ps512_cephes_log_q1;
  afVar97 = _ps512_cephes_exp_p5;
  afVar96 = _ps512_cephes_exp_p4;
  afVar95 = _ps512_cephes_exp_p3;
  afVar94 = _ps512_cephes_exp_p2;
  afVar93 = _ps512_cephes_exp_p1;
  afVar92 = _ps512_cephes_exp_p0;
  afVar91 = _ps512_cephes_LOG2EF;
  afVar90 = _ps512_exp_lo;
  afVar89 = _ps512_exp_hi;
  afVar88 = _ps512_1;
  iVar100 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_002b78ae;
  p_Var9 = this->_vptr_InnerProduct_x86_avx512[-3];
  uVar101 = *(uint *)(&this->field_0xe0 + (long)p_Var9);
  uVar121 = local_110 * iStack_fc;
  iVar100 = top_blob->elempack;
  uVar114 = top_blob->w;
  uVar103 = (ulong)uVar114;
  lVar11 = *(long *)(&this->field_0x178 + (long)p_Var9);
  if (iVar100 < 8) {
LAB_002b6258:
    if (iVar100 == 1) {
      local_d0 = (ulong)(int)uVar114;
      lVar115 = (long)(int)uVar121;
      if (0 < (int)uVar114 >> 3) {
        local_90 = (ulong)(uint)((int)uVar114 >> 3);
        lVar108 = lVar115 * 0x1c;
        local_98 = lVar115 * 0x20;
        lVar107 = lVar115 * 8;
        lVar112 = lVar115 * 0x18;
        local_b0 = lVar115 * 4;
        lVar116 = lVar115 * 0x14;
        local_b8 = lVar115 * 0xc;
        local_c0 = 0;
        auVar150 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar151 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar230._8_4_ = 0x3f000000;
        auVar230._0_8_ = 0x3f0000003f000000;
        auVar230._12_4_ = 0x3f000000;
        auVar230._16_4_ = 0x3f000000;
        auVar230._20_4_ = 0x3f000000;
        auVar230._24_4_ = 0x3f000000;
        auVar230._28_4_ = 0x3f000000;
        auVar152 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar239._8_4_ = 0x3f800000;
        auVar239._0_8_ = 0x3f8000003f800000;
        auVar239._12_4_ = 0x3f800000;
        auVar239._16_4_ = 0x3f800000;
        auVar239._20_4_ = 0x3f800000;
        auVar239._24_4_ = 0x3f800000;
        auVar239._28_4_ = 0x3f800000;
        auVar242._8_4_ = 0x3f318000;
        auVar242._0_8_ = 0x3f3180003f318000;
        auVar242._12_4_ = 0x3f318000;
        auVar242._16_4_ = 0x3f318000;
        auVar242._20_4_ = 0x3f318000;
        auVar242._24_4_ = 0x3f318000;
        auVar242._28_4_ = 0x3f318000;
        auVar249._8_4_ = 0x39506967;
        auVar249._0_8_ = 0x3950696739506967;
        auVar249._12_4_ = 0x39506967;
        auVar249._16_4_ = 0x39506967;
        auVar249._20_4_ = 0x39506967;
        auVar249._24_4_ = 0x39506967;
        auVar249._28_4_ = 0x39506967;
        auVar153 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar154 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar155 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar258._8_4_ = 0x3e2aaaaa;
        auVar258._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar258._12_4_ = 0x3e2aaaaa;
        auVar258._16_4_ = 0x3e2aaaaa;
        auVar258._20_4_ = 0x3e2aaaaa;
        auVar258._24_4_ = 0x3e2aaaaa;
        auVar258._28_4_ = 0x3e2aaaaa;
        auVar262._8_4_ = 0x3f800000;
        auVar262._0_8_ = 0x3f8000003f800000;
        auVar262._12_4_ = 0x3f800000;
        auVar262._16_4_ = 0x3f800000;
        auVar262._20_4_ = 0x3f800000;
        auVar262._24_4_ = 0x3f800000;
        auVar262._28_4_ = 0x3f800000;
        auVar264._8_4_ = 0xb95e8083;
        auVar264._0_8_ = 0xb95e8083b95e8083;
        auVar264._12_4_ = 0xb95e8083;
        auVar264._16_4_ = 0xb95e8083;
        auVar264._20_4_ = 0xb95e8083;
        auVar264._24_4_ = 0xb95e8083;
        auVar264._28_4_ = 0xb95e8083;
        auVar169 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar170 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar171 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar172 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar173 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar174 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar123 = vxorps_avx512vl(auVar125,auVar125);
        auVar175 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        uVar103 = 0;
        lVar119 = lVar115 << 4;
        do {
          local_a8 = lVar119;
          local_80 = uVar103 * 8;
          auVar188 = ZEXT1664(ZEXT816(0) << 0x40);
          if (lVar11 != 0) {
            auVar188 = ZEXT3264(*(undefined1 (*) [32])(lVar11 + uVar103 * 0x20));
          }
          auVar180 = auVar188._0_32_;
          pvVar105 = (this->weight_data_tm).data;
          if ((int)uVar121 < 8) {
            uVar117 = 0;
            lVar119 = local_80 * lVar115 * 4;
            lVar120 = (local_80 | 1) * lVar115 * 4;
            lVar1 = (local_80 | 2) * lVar115 * 4;
            lVar2 = (local_80 | 3) * lVar115 * 4;
            lVar3 = (local_80 | 4) * lVar115 * 4;
            lVar4 = (local_80 | 5) * lVar115 * 4;
            lVar5 = (local_80 | 6) * lVar115 * 4;
            lVar6 = (local_80 | 7) * lVar115 * 4;
            auVar159 = SUB6432(ZEXT864(0),0);
            auVar158 = ZEXT832(0);
            auVar157 = ZEXT832(0);
            auVar156 = SUB6432(ZEXT864(0),0);
            auVar179 = ZEXT832(0);
            auVar178 = SUB6432(ZEXT864(0),0);
            auVar177 = ZEXT832(0);
            auVar176 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            pauVar110 = local_128;
            local_a0 = lVar108;
          }
          else {
            auVar267 = ZEXT1664((undefined1  [16])0x0);
            iVar100 = 7;
            auVar272 = ZEXT864(0);
            auVar194 = ZEXT864(0);
            auVar191 = ZEXT864(0);
            auVar193 = ZEXT864(0);
            auVar190 = ZEXT864(0);
            auVar189 = ZEXT864(0);
            auVar192 = ZEXT864(0);
            lVar119 = 0;
            do {
              lVar106 = lVar119;
              auVar159 = *(undefined1 (*) [32])(*local_128 + lVar106);
              auVar176 = vfmadd231ps_avx512vl
                                   (auVar267._0_32_,auVar159,
                                    *(undefined1 (*) [32])((long)pvVar105 + lVar106 + local_c0));
              auVar267 = ZEXT3264(auVar176);
              auVar177 = vfmadd231ps_avx512vl
                                   (auVar272._0_32_,auVar159,
                                    *(undefined1 (*) [32])((long)pvVar105 + lVar106 + local_b0));
              auVar272 = ZEXT3264(auVar177);
              auVar178 = vfmadd231ps_avx512vl
                                   (auVar194._0_32_,auVar159,
                                    *(undefined1 (*) [32])((long)pvVar105 + lVar106 + lVar107));
              auVar194 = ZEXT3264(auVar178);
              auVar179 = vfmadd231ps_avx512vl
                                   (auVar191._0_32_,auVar159,
                                    *(undefined1 (*) [32])((long)pvVar105 + lVar106 + local_b8));
              auVar191 = ZEXT3264(auVar179);
              auVar156 = vfmadd231ps_avx512vl
                                   (auVar193._0_32_,auVar159,
                                    *(undefined1 (*) [32])((long)pvVar105 + lVar106 + local_a8));
              auVar193 = ZEXT3264(auVar156);
              auVar157 = vfmadd231ps_avx512vl
                                   (auVar190._0_32_,auVar159,
                                    *(undefined1 (*) [32])((long)pvVar105 + lVar106 + lVar116));
              auVar190 = ZEXT3264(auVar157);
              auVar158 = vfmadd231ps_avx512vl
                                   (auVar189._0_32_,auVar159,
                                    *(undefined1 (*) [32])((long)pvVar105 + lVar106 + lVar112));
              auVar189 = ZEXT3264(auVar158);
              auVar159 = vfmadd231ps_avx512vl
                                   (auVar192._0_32_,auVar159,
                                    *(undefined1 (*) [32])((long)pvVar105 + lVar106 + lVar108));
              auVar192 = ZEXT3264(auVar159);
              iVar100 = iVar100 + 8;
              lVar119 = lVar106 + 0x20;
            } while (iVar100 < (int)uVar121);
            lVar6 = lVar119 + lVar108;
            lVar5 = lVar119 + lVar112;
            lVar4 = lVar119 + lVar116;
            lVar3 = lVar119 + local_a8;
            lVar2 = lVar119 + local_b8;
            lVar1 = lVar119 + lVar107;
            lVar120 = lVar119 + local_b0;
            lVar119 = lVar119 + local_c0;
            pauVar110 = (undefined1 (*) [32])(local_128[1] + lVar106);
            uVar117 = uVar121 & 0xfffffff8;
          }
          if (uVar121 - uVar117 != 0 && (int)uVar117 <= (int)uVar121) {
            lVar106 = 0;
            do {
              auVar125 = vinsertps_avx512f(ZEXT416(*(uint *)((long)pvVar105 + lVar106 * 4 + lVar3)),
                                           ZEXT416(*(uint *)((long)pvVar105 + lVar106 * 4 + lVar4)),
                                           0x10);
              auVar125 = vinsertps_avx512f(auVar125,ZEXT416(*(uint *)((long)pvVar105 +
                                                                     lVar106 * 4 + lVar5)),0x20);
              auVar125 = vinsertps_avx512f(auVar125,ZEXT416(*(uint *)((long)pvVar105 +
                                                                     lVar106 * 4 + lVar6)),0x30);
              auVar124 = vinsertps_avx512f(ZEXT416(*(uint *)((long)pvVar105 + lVar106 * 4 + lVar119)
                                                  ),ZEXT416(*(uint *)((long)pvVar105 +
                                                                     lVar106 * 4 + lVar120)),0x10);
              auVar124 = vinsertps_avx512f(auVar124,ZEXT416(*(uint *)((long)pvVar105 +
                                                                     lVar106 * 4 + lVar1)),0x20);
              auVar124 = vinsertps_avx512f(auVar124,ZEXT416(*(uint *)((long)pvVar105 +
                                                                     lVar106 * 4 + lVar2)),0x30);
              auVar180 = vinsertf32x4_avx512vl(ZEXT1632(auVar124),auVar125,1);
              uVar7 = *(undefined4 *)(*pauVar110 + lVar106 * 4);
              auVar53._4_4_ = uVar7;
              auVar53._0_4_ = uVar7;
              auVar53._8_4_ = uVar7;
              auVar53._12_4_ = uVar7;
              auVar53._16_4_ = uVar7;
              auVar53._20_4_ = uVar7;
              auVar53._24_4_ = uVar7;
              auVar53._28_4_ = uVar7;
              auVar180 = vfmadd231ps_avx512vl(auVar188._0_32_,auVar180,auVar53);
              auVar188 = ZEXT3264(auVar180);
              lVar106 = lVar106 + 1;
            } while (uVar121 - uVar117 != (int)lVar106);
          }
          auVar176 = vhaddps_avx(auVar176,auVar177);
          auVar177 = vhaddps_avx(auVar178,auVar179);
          auVar177 = vhaddps_avx(auVar176,auVar177);
          auVar176 = vhaddps_avx(auVar156,auVar157);
          auVar178 = vhaddps_avx(auVar158,auVar159);
          auVar178 = vhaddps_avx(auVar176,auVar178);
          auVar176 = vblendps_avx(auVar177,auVar178,0xf0);
          auVar177 = vperm2f128_avx(auVar177,auVar178,0x21);
          auVar186._0_4_ = auVar177._0_4_ + auVar176._0_4_ + auVar180._0_4_;
          auVar186._4_4_ = auVar177._4_4_ + auVar176._4_4_ + auVar180._4_4_;
          auVar186._8_4_ = auVar177._8_4_ + auVar176._8_4_ + auVar180._8_4_;
          auVar186._12_4_ = auVar177._12_4_ + auVar176._12_4_ + auVar180._12_4_;
          auVar186._16_4_ = auVar177._16_4_ + auVar176._16_4_ + auVar180._16_4_;
          auVar186._20_4_ = auVar177._20_4_ + auVar176._20_4_ + auVar180._20_4_;
          auVar186._24_4_ = auVar177._24_4_ + auVar176._24_4_ + auVar180._24_4_;
          auVar186._28_4_ = auVar177._28_4_ + auVar176._28_4_ + auVar180._28_4_;
          if (uVar101 - 1 < 6) {
            auVar180 = ZEXT1632(auVar123);
            switch(uVar101) {
            case 1:
              auVar186 = vmaxps_avx512vl(auVar186,ZEXT1632(auVar123));
              break;
            case 2:
              auVar176 = vmaxps_avx512vl(auVar186,auVar180);
              auVar180 = vminps_avx512vl(auVar186,auVar180);
              uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
              auVar77._4_4_ = uVar7;
              auVar77._0_4_ = uVar7;
              auVar77._8_4_ = uVar7;
              auVar77._12_4_ = uVar7;
              auVar77._16_4_ = uVar7;
              auVar77._20_4_ = uVar7;
              auVar77._24_4_ = uVar7;
              auVar77._28_4_ = uVar7;
              auVar186 = vfmadd132ps_avx512vl(auVar180,auVar176,auVar77);
              break;
            case 3:
              uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
              auVar75._4_4_ = uVar7;
              auVar75._0_4_ = uVar7;
              auVar75._8_4_ = uVar7;
              auVar75._12_4_ = uVar7;
              auVar75._16_4_ = uVar7;
              auVar75._20_4_ = uVar7;
              auVar75._24_4_ = uVar7;
              auVar75._28_4_ = uVar7;
              auVar180 = vmaxps_avx512vl(auVar186,auVar75);
              uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var9))[1];
              auVar76._4_4_ = uVar7;
              auVar76._0_4_ = uVar7;
              auVar76._8_4_ = uVar7;
              auVar76._12_4_ = uVar7;
              auVar76._16_4_ = uVar7;
              auVar76._20_4_ = uVar7;
              auVar76._24_4_ = uVar7;
              auVar76._28_4_ = uVar7;
              auVar186 = vminps_avx512vl(auVar180,auVar76);
              break;
            case 4:
              auVar73._8_4_ = 0x80000000;
              auVar73._0_8_ = 0x8000000080000000;
              auVar73._12_4_ = 0x80000000;
              auVar73._16_4_ = 0x80000000;
              auVar73._20_4_ = 0x80000000;
              auVar73._24_4_ = 0x80000000;
              auVar73._28_4_ = 0x80000000;
              auVar180 = vxorps_avx512vl(auVar186,auVar73);
              auVar180 = vminps_avx512vl(auVar180,auVar150);
              auVar176 = vmaxps_avx512vl(auVar180,auVar151);
              auVar177 = vfmadd231ps_avx512vl(auVar230,auVar176,auVar152);
              auVar180 = vroundps_avx(auVar177,1);
              uVar102 = vcmpps_avx512vl(auVar177,auVar180,1);
              auVar178 = vsubps_avx512vl(auVar180,auVar239);
              bVar14 = (bool)((byte)uVar102 & 1);
              auVar187._0_4_ =
                   (float)((uint)bVar14 * auVar178._0_4_ | (uint)!bVar14 * auVar180._0_4_);
              bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
              auVar187._4_4_ =
                   (float)((uint)bVar14 * auVar178._4_4_ | (uint)!bVar14 * auVar180._4_4_);
              bVar14 = (bool)((byte)(uVar102 >> 2) & 1);
              auVar187._8_4_ =
                   (float)((uint)bVar14 * auVar178._8_4_ | (uint)!bVar14 * auVar180._8_4_);
              bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
              auVar187._12_4_ =
                   (float)((uint)bVar14 * auVar178._12_4_ | (uint)!bVar14 * auVar180._12_4_);
              bVar14 = (bool)((byte)(uVar102 >> 4) & 1);
              auVar187._16_4_ =
                   (float)((uint)bVar14 * auVar178._16_4_ | (uint)!bVar14 * auVar180._16_4_);
              bVar14 = (bool)((byte)(uVar102 >> 5) & 1);
              auVar187._20_4_ =
                   (float)((uint)bVar14 * auVar178._20_4_ | (uint)!bVar14 * auVar180._20_4_);
              bVar14 = (bool)((byte)(uVar102 >> 6) & 1);
              auVar187._24_4_ =
                   (float)((uint)bVar14 * auVar178._24_4_ | (uint)!bVar14 * auVar180._24_4_);
              bVar14 = SUB81(uVar102 >> 7,0);
              auVar187._28_4_ =
                   (float)((uint)bVar14 * auVar178._28_4_ | (uint)!bVar14 * auVar180._28_4_);
              auVar125 = vfmsub231ps_fma(auVar176,auVar187,auVar242);
              auVar74._8_4_ = 0x395e8083;
              auVar74._0_8_ = 0x395e8083395e8083;
              auVar74._12_4_ = 0x395e8083;
              auVar74._16_4_ = 0x395e8083;
              auVar74._20_4_ = 0x395e8083;
              auVar74._24_4_ = 0x395e8083;
              auVar74._28_4_ = 0x395e8083;
              auVar180 = vfmsub231ps_avx512vl(ZEXT1632(auVar125),auVar187,auVar74);
              auVar80._4_4_ = auVar180._4_4_ * auVar180._4_4_;
              auVar80._0_4_ = auVar180._0_4_ * auVar180._0_4_;
              auVar80._8_4_ = auVar180._8_4_ * auVar180._8_4_;
              auVar80._12_4_ = auVar180._12_4_ * auVar180._12_4_;
              auVar80._16_4_ = auVar180._16_4_ * auVar180._16_4_;
              auVar80._20_4_ = auVar180._20_4_ * auVar180._20_4_;
              auVar80._24_4_ = auVar180._24_4_ * auVar180._24_4_;
              auVar80._28_4_ = auVar177._28_4_;
              auVar176 = vfmadd213ps_avx512vl(auVar249,auVar180,auVar153);
              auVar176 = vfmadd213ps_avx512vl(auVar176,auVar180,auVar154);
              auVar176 = vfmadd213ps_avx512vl(auVar176,auVar180,auVar155);
              auVar125 = vfmadd213ps_fma(auVar176,auVar180,auVar258);
              auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar180,auVar230);
              auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar80,auVar180);
              auVar212._0_4_ = auVar125._0_4_ + 1.0;
              auVar212._4_4_ = auVar125._4_4_ + 1.0;
              auVar212._8_4_ = auVar125._8_4_ + 1.0;
              auVar212._12_4_ = auVar125._12_4_ + 1.0;
              auVar212._16_4_ = 0x3f800000;
              auVar212._20_4_ = 0x3f800000;
              auVar212._24_4_ = 0x3f800000;
              auVar212._28_4_ = 0x3f800000;
              auVar204._0_4_ = (int)auVar187._0_4_;
              auVar204._4_4_ = (int)auVar187._4_4_;
              auVar204._8_4_ = (int)auVar187._8_4_;
              auVar204._12_4_ = (int)auVar187._12_4_;
              auVar204._16_4_ = (int)auVar187._16_4_;
              auVar204._20_4_ = (int)auVar187._20_4_;
              auVar204._24_4_ = (int)auVar187._24_4_;
              auVar204._28_4_ = (int)auVar187._28_4_;
              auVar180 = vpslld_avx2(auVar204,0x17);
              auVar180 = vpaddd_avx2(auVar262,auVar180);
              auVar125 = vfmadd213ps_fma(auVar180,auVar212,auVar239);
              auVar180 = vrcpps_avx(ZEXT1632(auVar125));
              auVar125 = vfmsub213ps_fma(ZEXT1632(auVar125),auVar180,auVar239);
              auVar125 = vfnmadd132ps_fma(ZEXT1632(auVar125),auVar180,auVar180);
              auVar186 = ZEXT1632(auVar125);
              break;
            case 5:
              auVar176 = vminps_avx512vl(auVar186,auVar150);
              auVar177 = vmaxps_avx512vl(auVar176,auVar151);
              auVar125 = vfmadd213ps_fma(auVar152,auVar177,auVar230);
              auVar176 = vroundps_avx(ZEXT1632(auVar125),1);
              uVar102 = vcmpps_avx512vl(ZEXT1632(auVar125),auVar176,1);
              auVar178 = vsubps_avx512vl(auVar176,auVar239);
              bVar14 = (bool)((byte)uVar102 & 1);
              auVar181._0_4_ =
                   (float)((uint)bVar14 * auVar178._0_4_ | (uint)!bVar14 * auVar176._0_4_);
              bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
              auVar181._4_4_ =
                   (float)((uint)bVar14 * auVar178._4_4_ | (uint)!bVar14 * auVar176._4_4_);
              bVar14 = (bool)((byte)(uVar102 >> 2) & 1);
              auVar181._8_4_ =
                   (float)((uint)bVar14 * auVar178._8_4_ | (uint)!bVar14 * auVar176._8_4_);
              bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
              auVar181._12_4_ =
                   (float)((uint)bVar14 * auVar178._12_4_ | (uint)!bVar14 * auVar176._12_4_);
              bVar14 = (bool)((byte)(uVar102 >> 4) & 1);
              auVar181._16_4_ =
                   (float)((uint)bVar14 * auVar178._16_4_ | (uint)!bVar14 * auVar176._16_4_);
              bVar14 = (bool)((byte)(uVar102 >> 5) & 1);
              auVar181._20_4_ =
                   (float)((uint)bVar14 * auVar178._20_4_ | (uint)!bVar14 * auVar176._20_4_);
              bVar14 = (bool)((byte)(uVar102 >> 6) & 1);
              auVar181._24_4_ =
                   (float)((uint)bVar14 * auVar178._24_4_ | (uint)!bVar14 * auVar176._24_4_);
              bVar14 = SUB81(uVar102 >> 7,0);
              auVar181._28_4_ =
                   (float)((uint)bVar14 * auVar178._28_4_ | (uint)!bVar14 * auVar176._28_4_);
              auVar125 = vfmsub231ps_fma(auVar177,auVar181,auVar242);
              auVar124 = vfnmsub231ps_fma(ZEXT1632(auVar125),auVar181,auVar264);
              auVar177 = ZEXT1632(auVar124);
              auVar176 = vfmadd213ps_avx512vl(auVar249,auVar177,auVar153);
              auVar176 = vfmadd213ps_avx512vl(auVar176,auVar177,auVar154);
              auVar176 = vfmadd213ps_avx512vl(auVar176,auVar177,auVar155);
              auVar177 = ZEXT1632(auVar124);
              auVar125 = vfmadd213ps_fma(auVar176,auVar177,auVar258);
              auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar177,auVar230);
              auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),
                                         ZEXT1632(CONCAT412(auVar124._12_4_ * auVar124._12_4_,
                                                            CONCAT48(auVar124._8_4_ * auVar124._8_4_
                                                                     ,CONCAT44(auVar124._4_4_ *
                                                                               auVar124._4_4_,
                                                                               auVar124._0_4_ *
                                                                               auVar124._0_4_)))),
                                         auVar177);
              auVar210._0_4_ = auVar125._0_4_ + 1.0;
              auVar210._4_4_ = auVar125._4_4_ + 1.0;
              auVar210._8_4_ = auVar125._8_4_ + 1.0;
              auVar210._12_4_ = auVar125._12_4_ + 1.0;
              auVar210._16_4_ = 0x3f800000;
              auVar210._20_4_ = 0x3f800000;
              auVar210._24_4_ = 0x3f800000;
              auVar210._28_4_ = 0x3f800000;
              auVar222._0_4_ = (int)auVar181._0_4_;
              auVar222._4_4_ = (int)auVar181._4_4_;
              auVar222._8_4_ = (int)auVar181._8_4_;
              auVar222._12_4_ = (int)auVar181._12_4_;
              auVar222._16_4_ = (int)auVar181._16_4_;
              auVar222._20_4_ = (int)auVar181._20_4_;
              auVar222._24_4_ = (int)auVar181._24_4_;
              auVar222._28_4_ = (int)auVar181._28_4_;
              auVar176 = vpslld_avx2(auVar222,0x17);
              auVar176 = vpaddd_avx2(auVar262,auVar176);
              auVar125 = vfmadd213ps_fma(auVar176,auVar210,auVar239);
              uVar102 = vcmpps_avx512vl(ZEXT1632(auVar125),auVar180,2);
              auVar65._8_4_ = 0x800000;
              auVar65._0_8_ = 0x80000000800000;
              auVar65._12_4_ = 0x800000;
              auVar65._16_4_ = 0x800000;
              auVar65._20_4_ = 0x800000;
              auVar65._24_4_ = 0x800000;
              auVar65._28_4_ = 0x800000;
              auVar180 = vmaxps_avx512vl(ZEXT1632(auVar125),auVar65);
              auVar178 = vpsrld_avx2(auVar180,0x17);
              auVar235._8_4_ = 0x807fffff;
              auVar235._0_8_ = 0x807fffff807fffff;
              auVar235._12_4_ = 0x807fffff;
              auVar235._16_4_ = 0x807fffff;
              auVar235._20_4_ = 0x807fffff;
              auVar235._24_4_ = 0x807fffff;
              auVar235._28_4_ = 0x807fffff;
              auVar66._8_4_ = 0x3f000000;
              auVar66._0_8_ = 0x3f0000003f000000;
              auVar66._12_4_ = 0x3f000000;
              auVar66._16_4_ = 0x3f000000;
              auVar66._20_4_ = 0x3f000000;
              auVar66._24_4_ = 0x3f000000;
              auVar66._28_4_ = 0x3f000000;
              auVar180 = vpternlogd_avx512vl(auVar180,auVar235,auVar66,0xea);
              auVar67._8_4_ = 0x3f3504f3;
              auVar67._0_8_ = 0x3f3504f33f3504f3;
              auVar67._12_4_ = 0x3f3504f3;
              auVar67._16_4_ = 0x3f3504f3;
              auVar67._20_4_ = 0x3f3504f3;
              auVar67._24_4_ = 0x3f3504f3;
              auVar67._28_4_ = 0x3f3504f3;
              uVar16 = vcmpps_avx512vl(auVar180,auVar67,1);
              auVar176 = vaddps_avx512vl(auVar180,auVar169);
              auVar177 = vaddps_avx512vl(auVar176,auVar180);
              bVar14 = (bool)((byte)uVar16 & 1);
              auVar182._0_4_ =
                   (float)((uint)bVar14 * auVar177._0_4_ | (uint)!bVar14 * auVar176._0_4_);
              bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
              auVar182._4_4_ =
                   (float)((uint)bVar14 * auVar177._4_4_ | (uint)!bVar14 * auVar176._4_4_);
              bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
              auVar182._8_4_ =
                   (float)((uint)bVar14 * auVar177._8_4_ | (uint)!bVar14 * auVar176._8_4_);
              bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
              auVar182._12_4_ =
                   (float)((uint)bVar14 * auVar177._12_4_ | (uint)!bVar14 * auVar176._12_4_);
              bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
              auVar182._16_4_ =
                   (float)((uint)bVar14 * auVar177._16_4_ | (uint)!bVar14 * auVar176._16_4_);
              bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
              auVar182._20_4_ =
                   (float)((uint)bVar14 * auVar177._20_4_ | (uint)!bVar14 * auVar176._20_4_);
              bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
              auVar182._24_4_ =
                   (float)((uint)bVar14 * auVar177._24_4_ | (uint)!bVar14 * auVar176._24_4_);
              bVar14 = SUB81(uVar16 >> 7,0);
              auVar182._28_4_ = (uint)bVar14 * auVar177._28_4_ | (uint)!bVar14 * auVar176._28_4_;
              auVar78._4_4_ = auVar182._4_4_ * auVar182._4_4_;
              auVar78._0_4_ = auVar182._0_4_ * auVar182._0_4_;
              auVar78._8_4_ = auVar182._8_4_ * auVar182._8_4_;
              auVar78._12_4_ = auVar182._12_4_ * auVar182._12_4_;
              auVar78._16_4_ = auVar182._16_4_ * auVar182._16_4_;
              auVar78._20_4_ = auVar182._20_4_ * auVar182._20_4_;
              auVar78._24_4_ = auVar182._24_4_ * auVar182._24_4_;
              auVar78._28_4_ = auVar180._28_4_;
              auVar68._8_4_ = 0xbdebd1b8;
              auVar68._0_8_ = 0xbdebd1b8bdebd1b8;
              auVar68._12_4_ = 0xbdebd1b8;
              auVar68._16_4_ = 0xbdebd1b8;
              auVar68._20_4_ = 0xbdebd1b8;
              auVar68._24_4_ = 0xbdebd1b8;
              auVar68._28_4_ = 0xbdebd1b8;
              auVar180 = vfmadd213ps_avx512vl(auVar170,auVar182,auVar68);
              auVar69._8_4_ = 0x3def251a;
              auVar69._0_8_ = 0x3def251a3def251a;
              auVar69._12_4_ = 0x3def251a;
              auVar69._16_4_ = 0x3def251a;
              auVar69._20_4_ = 0x3def251a;
              auVar69._24_4_ = 0x3def251a;
              auVar69._28_4_ = 0x3def251a;
              auVar180 = vfmadd213ps_avx512vl(auVar180,auVar182,auVar69);
              auVar70._8_4_ = 0xbdfe5d4f;
              auVar70._0_8_ = 0xbdfe5d4fbdfe5d4f;
              auVar70._12_4_ = 0xbdfe5d4f;
              auVar70._16_4_ = 0xbdfe5d4f;
              auVar70._20_4_ = 0xbdfe5d4f;
              auVar70._24_4_ = 0xbdfe5d4f;
              auVar70._28_4_ = 0xbdfe5d4f;
              auVar180 = vfmadd213ps_avx512vl(auVar180,auVar182,auVar70);
              auVar71._8_4_ = 0x3e11e9bf;
              auVar71._0_8_ = 0x3e11e9bf3e11e9bf;
              auVar71._12_4_ = 0x3e11e9bf;
              auVar71._16_4_ = 0x3e11e9bf;
              auVar71._20_4_ = 0x3e11e9bf;
              auVar71._24_4_ = 0x3e11e9bf;
              auVar71._28_4_ = 0x3e11e9bf;
              auVar180 = vfmadd213ps_avx512vl(auVar180,auVar182,auVar71);
              auVar180 = vfmadd213ps_avx512vl(auVar180,auVar182,auVar171);
              auVar180 = vfmadd213ps_avx512vl(auVar180,auVar182,auVar172);
              auVar180 = vfmadd213ps_avx512vl(auVar180,auVar182,auVar173);
              auVar180 = vfmadd213ps_avx512vl(auVar180,auVar182,auVar174);
              auVar79._4_4_ = auVar182._4_4_ * auVar182._4_4_ * auVar182._4_4_ * auVar180._4_4_;
              auVar79._0_4_ = auVar182._0_4_ * auVar182._0_4_ * auVar182._0_4_ * auVar180._0_4_;
              auVar79._8_4_ = auVar182._8_4_ * auVar182._8_4_ * auVar182._8_4_ * auVar180._8_4_;
              auVar79._12_4_ = auVar182._12_4_ * auVar182._12_4_ * auVar182._12_4_ * auVar180._12_4_
              ;
              auVar79._16_4_ = auVar182._16_4_ * auVar182._16_4_ * auVar182._16_4_ * auVar180._16_4_
              ;
              auVar79._20_4_ = auVar182._20_4_ * auVar182._20_4_ * auVar182._20_4_ * auVar180._20_4_
              ;
              auVar79._24_4_ = auVar182._24_4_ * auVar182._24_4_ * auVar182._24_4_ * auVar180._24_4_
              ;
              auVar79._28_4_ = auVar180._28_4_;
              auVar72._8_4_ = 0xffffff82;
              auVar72._0_8_ = 0xffffff82ffffff82;
              auVar72._12_4_ = 0xffffff82;
              auVar72._16_4_ = 0xffffff82;
              auVar72._20_4_ = 0xffffff82;
              auVar72._24_4_ = 0xffffff82;
              auVar72._28_4_ = 0xffffff82;
              auVar180 = vpaddd_avx512vl(auVar178,auVar72);
              auVar180 = vcvtdq2ps_avx(auVar180);
              auVar176 = vsubps_avx512vl(auVar180,auVar239);
              bVar14 = (bool)((byte)uVar16 & 1);
              auVar183._0_4_ = (uint)bVar14 * auVar176._0_4_ | (uint)!bVar14 * auVar180._0_4_;
              bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
              auVar183._4_4_ = (uint)bVar14 * auVar176._4_4_ | (uint)!bVar14 * auVar180._4_4_;
              bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
              auVar183._8_4_ = (uint)bVar14 * auVar176._8_4_ | (uint)!bVar14 * auVar180._8_4_;
              bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
              auVar183._12_4_ = (uint)bVar14 * auVar176._12_4_ | (uint)!bVar14 * auVar180._12_4_;
              bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
              auVar183._16_4_ = (uint)bVar14 * auVar176._16_4_ | (uint)!bVar14 * auVar180._16_4_;
              bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
              auVar183._20_4_ = (uint)bVar14 * auVar176._20_4_ | (uint)!bVar14 * auVar180._20_4_;
              bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
              auVar183._24_4_ = (uint)bVar14 * auVar176._24_4_ | (uint)!bVar14 * auVar180._24_4_;
              bVar14 = SUB81(uVar16 >> 7,0);
              auVar183._28_4_ = (uint)bVar14 * auVar176._28_4_ | (uint)!bVar14 * auVar180._28_4_;
              auVar125 = vfmadd231ps_fma(auVar79,auVar183,auVar264);
              auVar125 = vfmsub231ps_fma(ZEXT1632(auVar125),auVar230,auVar78);
              auVar180 = vsubps_avx(ZEXT1632(auVar125),auVar182);
              auVar125 = vfmsub231ps_fma(auVar180,auVar242,auVar183);
              auVar180 = vmulps_avx512vl(ZEXT1632(auVar125),auVar175);
              auVar176 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              bVar14 = (bool)((byte)uVar102 & 1);
              auVar184._0_4_ = (uint)bVar14 * auVar176._0_4_ | (uint)!bVar14 * auVar180._0_4_;
              bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
              auVar184._4_4_ = (uint)bVar14 * auVar176._4_4_ | (uint)!bVar14 * auVar180._4_4_;
              bVar14 = (bool)((byte)(uVar102 >> 2) & 1);
              auVar184._8_4_ = (uint)bVar14 * auVar176._8_4_ | (uint)!bVar14 * auVar180._8_4_;
              bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
              auVar184._12_4_ = (uint)bVar14 * auVar176._12_4_ | (uint)!bVar14 * auVar180._12_4_;
              bVar14 = (bool)((byte)(uVar102 >> 4) & 1);
              auVar184._16_4_ = (uint)bVar14 * auVar176._16_4_ | (uint)!bVar14 * auVar180._16_4_;
              bVar14 = (bool)((byte)(uVar102 >> 5) & 1);
              auVar184._20_4_ = (uint)bVar14 * auVar176._20_4_ | (uint)!bVar14 * auVar180._20_4_;
              bVar14 = (bool)((byte)(uVar102 >> 6) & 1);
              auVar184._24_4_ = (uint)bVar14 * auVar176._24_4_ | (uint)!bVar14 * auVar180._24_4_;
              bVar14 = SUB81(uVar102 >> 7,0);
              auVar184._28_4_ = (uint)bVar14 * auVar176._28_4_ | (uint)!bVar14 * auVar180._28_4_;
              auVar180 = vminps_avx512vl(auVar184,auVar150);
              auVar176 = vmaxps_avx512vl(auVar180,auVar151);
              auVar125 = vfmadd213ps_fma(auVar152,auVar176,auVar230);
              auVar180 = vroundps_avx(ZEXT1632(auVar125),1);
              uVar102 = vcmpps_avx512vl(ZEXT1632(auVar125),auVar180,1);
              auVar177 = vsubps_avx512vl(auVar180,auVar239);
              bVar14 = (bool)((byte)uVar102 & 1);
              auVar185._0_4_ =
                   (float)((uint)bVar14 * auVar177._0_4_ | (uint)!bVar14 * auVar180._0_4_);
              bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
              auVar185._4_4_ =
                   (float)((uint)bVar14 * auVar177._4_4_ | (uint)!bVar14 * auVar180._4_4_);
              bVar14 = (bool)((byte)(uVar102 >> 2) & 1);
              auVar185._8_4_ =
                   (float)((uint)bVar14 * auVar177._8_4_ | (uint)!bVar14 * auVar180._8_4_);
              bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
              auVar185._12_4_ =
                   (float)((uint)bVar14 * auVar177._12_4_ | (uint)!bVar14 * auVar180._12_4_);
              bVar14 = (bool)((byte)(uVar102 >> 4) & 1);
              auVar185._16_4_ =
                   (float)((uint)bVar14 * auVar177._16_4_ | (uint)!bVar14 * auVar180._16_4_);
              bVar14 = (bool)((byte)(uVar102 >> 5) & 1);
              auVar185._20_4_ =
                   (float)((uint)bVar14 * auVar177._20_4_ | (uint)!bVar14 * auVar180._20_4_);
              bVar14 = (bool)((byte)(uVar102 >> 6) & 1);
              auVar185._24_4_ =
                   (float)((uint)bVar14 * auVar177._24_4_ | (uint)!bVar14 * auVar180._24_4_);
              bVar14 = SUB81(uVar102 >> 7,0);
              auVar185._28_4_ =
                   (float)((uint)bVar14 * auVar177._28_4_ | (uint)!bVar14 * auVar180._28_4_);
              auVar125 = vfmsub231ps_fma(auVar176,auVar185,auVar242);
              auVar124 = vfnmsub231ps_fma(ZEXT1632(auVar125),auVar185,auVar264);
              auVar176 = ZEXT1632(auVar124);
              auVar180 = vfmadd213ps_avx512vl(auVar249,auVar176,auVar153);
              auVar180 = vfmadd213ps_avx512vl(auVar180,auVar176,auVar154);
              auVar180 = vfmadd213ps_avx512vl(auVar180,auVar176,auVar155);
              auVar176 = ZEXT1632(auVar124);
              auVar125 = vfmadd213ps_fma(auVar180,auVar176,auVar258);
              auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),auVar176,auVar230);
              auVar125 = vfmadd213ps_fma(ZEXT1632(auVar125),
                                         ZEXT1632(CONCAT412(auVar124._12_4_ * auVar124._12_4_,
                                                            CONCAT48(auVar124._8_4_ * auVar124._8_4_
                                                                     ,CONCAT44(auVar124._4_4_ *
                                                                               auVar124._4_4_,
                                                                               auVar124._0_4_ *
                                                                               auVar124._0_4_)))),
                                         auVar176);
              auVar211._0_4_ = auVar125._0_4_ + 1.0;
              auVar211._4_4_ = auVar125._4_4_ + 1.0;
              auVar211._8_4_ = auVar125._8_4_ + 1.0;
              auVar211._12_4_ = auVar125._12_4_ + 1.0;
              auVar211._16_4_ = 0x3f800000;
              auVar211._20_4_ = 0x3f800000;
              auVar211._24_4_ = 0x3f800000;
              auVar211._28_4_ = 0x3f800000;
              auVar223._0_4_ = (int)auVar185._0_4_;
              auVar223._4_4_ = (int)auVar185._4_4_;
              auVar223._8_4_ = (int)auVar185._8_4_;
              auVar223._12_4_ = (int)auVar185._12_4_;
              auVar223._16_4_ = (int)auVar185._16_4_;
              auVar223._20_4_ = (int)auVar185._20_4_;
              auVar223._24_4_ = (int)auVar185._24_4_;
              auVar223._28_4_ = (int)auVar185._28_4_;
              auVar180 = vpslld_avx2(auVar223,0x17);
              auVar180 = vpaddd_avx2(auVar262,auVar180);
              auVar125 = vfmadd213ps_fma(auVar180,auVar211,auVar239);
              auVar180 = vrcpps_avx(ZEXT1632(auVar125));
              auVar125 = vfmsub213ps_fma(ZEXT1632(auVar125),auVar180,auVar239);
              auVar125 = vfnmadd132ps_fma(ZEXT1632(auVar125),auVar180,auVar180);
              auVar180 = vfnmadd213ps_avx512vl(ZEXT1632(auVar125),auVar175,auVar169);
              auVar186._4_4_ = auVar180._4_4_ * auVar186._4_4_;
              auVar186._0_4_ = auVar180._0_4_ * auVar186._0_4_;
              auVar186._8_4_ = auVar180._8_4_ * auVar186._8_4_;
              auVar186._12_4_ = auVar180._12_4_ * auVar186._12_4_;
              auVar186._16_4_ = auVar180._16_4_ * auVar186._16_4_;
              auVar186._20_4_ = auVar180._20_4_ * auVar186._20_4_;
              auVar186._24_4_ = auVar180._24_4_ * auVar186._24_4_;
              break;
            case 6:
              uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
              auVar213._4_4_ = uVar7;
              auVar213._0_4_ = uVar7;
              auVar213._8_4_ = uVar7;
              auVar213._12_4_ = uVar7;
              auVar213._16_4_ = uVar7;
              auVar213._20_4_ = uVar7;
              auVar213._24_4_ = uVar7;
              auVar213._28_4_ = uVar7;
              uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var9))[1];
              auVar64._4_4_ = uVar7;
              auVar64._0_4_ = uVar7;
              auVar64._8_4_ = uVar7;
              auVar64._12_4_ = uVar7;
              auVar64._16_4_ = uVar7;
              auVar64._20_4_ = uVar7;
              auVar64._24_4_ = uVar7;
              auVar64._28_4_ = uVar7;
              auVar176 = vfmadd213ps_avx512vl(auVar213,auVar186,auVar64);
              auVar180 = vmaxps_avx512vl(auVar176,auVar180);
              auVar180 = vminps_avx(auVar180,auVar239);
              auVar186._4_4_ = auVar180._4_4_ * auVar186._4_4_;
              auVar186._0_4_ = auVar180._0_4_ * auVar186._0_4_;
              auVar186._8_4_ = auVar180._8_4_ * auVar186._8_4_;
              auVar186._12_4_ = auVar180._12_4_ * auVar186._12_4_;
              auVar186._16_4_ = auVar180._16_4_ * auVar186._16_4_;
              auVar186._20_4_ = auVar180._20_4_ * auVar186._20_4_;
              auVar186._24_4_ = auVar180._24_4_ * auVar186._24_4_;
            }
          }
          *(undefined1 (*) [32])((long)top_blob->data + uVar103 * 0x20) = auVar186;
          uVar103 = uVar103 + 1;
          lVar108 = lVar108 + local_98;
          lVar112 = lVar112 + local_98;
          lVar116 = lVar116 + local_98;
          local_b8 = local_b8 + local_98;
          lVar107 = lVar107 + local_98;
          local_b0 = local_b0 + local_98;
          local_c0 = local_c0 + local_98;
          lVar119 = local_a8 + local_98;
          local_c8 = top_blob;
          local_88 = (ulong)uVar101;
        } while (uVar103 != local_90);
      }
      uVar103 = local_d0 & 0xfffffffffffffff8;
      if ((uVar114 >> 2 & 1) != 0) {
        if (lVar11 == 0) {
          auVar123 = ZEXT816(0) << 0x40;
        }
        else {
          auVar123 = *(undefined1 (*) [16])(lVar11 + uVar103 * 4);
        }
        pvVar12 = (this->weight_data_tm).data;
        pvVar105 = (void *)((long)pvVar12 + uVar103 * lVar115 * 4);
        if ((int)uVar121 < 8) {
          uVar117 = 0;
          lVar107 = (uVar103 | 1) * lVar115 * 4;
          lVar116 = (uVar103 | 2) * lVar115 * 4;
          lVar108 = (uVar103 | 3) * lVar115 * 4;
          auVar125 = ZEXT816(0);
          auVar124 = ZEXT816(0);
          auVar126 = ZEXT816(0);
          auVar127 = ZEXT816(0);
          pauVar110 = local_128;
        }
        else {
          uVar117 = uVar121 & 0xfffffff8;
          lVar107 = (uVar103 + 3) * lVar115;
          lVar116 = (uVar103 + 2) * lVar115;
          lVar119 = (uVar103 + 1) * lVar115;
          auVar127 = ZEXT816(0);
          iVar100 = 7;
          auVar126 = ZEXT816(0);
          auVar124 = ZEXT816(0);
          auVar125 = ZEXT816(0);
          lVar112 = 0;
          do {
            lVar120 = lVar112;
            auVar150 = *(undefined1 (*) [32])(*local_128 + lVar120);
            auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar150,
                                       *(undefined1 (*) [32])((long)pvVar105 + lVar120));
            auVar124 = vfmadd231ps_fma(ZEXT1632(auVar124),auVar150,
                                       *(undefined1 (*) [32])((long)pvVar12 + lVar120 + lVar119 * 4)
                                      );
            auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar150,
                                       *(undefined1 (*) [32])((long)pvVar12 + lVar120 + lVar116 * 4)
                                      );
            auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar150,
                                       *(undefined1 (*) [32])((long)pvVar12 + lVar120 + lVar107 * 4)
                                      );
            iVar100 = iVar100 + 8;
            lVar112 = lVar120 + 0x20;
          } while (iVar100 < (int)uVar121);
          lVar108 = lVar112 + lVar107 * 4;
          lVar116 = lVar112 + lVar116 * 4;
          lVar107 = lVar112 + lVar119 * 4;
          pvVar105 = (void *)((long)pvVar105 + lVar112);
          pauVar110 = (undefined1 (*) [32])(local_128[1] + lVar120);
        }
        lVar107 = (long)pvVar12 + lVar107;
        lVar116 = (long)pvVar12 + lVar116;
        lVar108 = (long)pvVar12 + lVar108;
        auVar128 = ZEXT816(0) << 0x40;
        if ((int)(uVar117 | 3) < (int)uVar121) {
          auVar201 = ZEXT816(0);
          lVar112 = 0;
          auVar130 = ZEXT816(0);
          auVar188 = ZEXT864(0);
          uVar118 = uVar117;
          do {
            auVar135 = *(undefined1 (*) [16])(*pauVar110 + lVar112);
            auVar128 = vfmadd231ps_fma(auVar128,auVar135,
                                       *(undefined1 (*) [16])((long)pvVar105 + lVar112));
            auVar129 = vfmadd231ps_fma(auVar188._0_16_,auVar135,
                                       *(undefined1 (*) [16])(lVar107 + lVar112));
            auVar188 = ZEXT1664(auVar129);
            auVar130 = vfmadd231ps_fma(auVar130,auVar135,*(undefined1 (*) [16])(lVar116 + lVar112));
            auVar201 = vfmadd231ps_fma(auVar201,auVar135,*(undefined1 (*) [16])(lVar108 + lVar112));
            uVar117 = uVar118 + 4;
            iVar100 = uVar118 + 7;
            lVar112 = lVar112 + 0x10;
            uVar118 = uVar117;
          } while (iVar100 < (int)uVar121);
          pauVar110 = (undefined1 (*) [32])(*pauVar110 + lVar112);
          lVar108 = lVar108 + lVar112;
          lVar116 = lVar116 + lVar112;
          lVar107 = lVar107 + lVar112;
          pvVar105 = (void *)((long)pvVar105 + lVar112);
        }
        else {
          auVar129 = SUB6416(ZEXT864(0),0);
          auVar130 = ZEXT816(0);
          auVar201 = ZEXT816(0);
        }
        if (uVar121 - uVar117 != 0 && (int)uVar117 <= (int)uVar121) {
          lVar112 = 0;
          do {
            auVar135 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar105 + lVar112 * 4)),
                                     ZEXT416(*(uint *)(lVar107 + lVar112 * 4)),0x10);
            auVar135 = vinsertps_avx(auVar135,ZEXT416(*(uint *)(lVar116 + lVar112 * 4)),0x20);
            auVar135 = vinsertps_avx(auVar135,ZEXT416(*(uint *)(lVar108 + lVar112 * 4)),0x30);
            uVar7 = *(undefined4 *)(*pauVar110 + lVar112 * 4);
            auVar132._4_4_ = uVar7;
            auVar132._0_4_ = uVar7;
            auVar132._8_4_ = uVar7;
            auVar132._12_4_ = uVar7;
            auVar123 = vfmadd231ps_avx512vl(auVar123,auVar135,auVar132);
            lVar112 = lVar112 + 1;
          } while (uVar121 - uVar117 != (int)lVar112);
        }
        auVar150 = vhaddps_avx(ZEXT1632(auVar125),ZEXT1632(auVar124));
        auVar151 = vhaddps_avx(ZEXT1632(auVar126),ZEXT1632(auVar127));
        auVar150 = vhaddps_avx(auVar150,auVar151);
        auVar126 = vunpcklps_avx(auVar128,auVar129);
        auVar127 = vunpcklps_avx(auVar130,auVar201);
        auVar125 = vunpckhps_avx(auVar128,auVar129);
        auVar128 = vunpckhps_avx(auVar130,auVar201);
        auVar124 = vmovlhps_avx(auVar126,auVar127);
        auVar127 = vunpckhpd_avx(auVar126,auVar127);
        auVar126 = vmovlhps_avx(auVar125,auVar128);
        auVar128 = vunpckhpd_avx(auVar125,auVar128);
        auVar125._0_4_ =
             auVar127._0_4_ + auVar124._0_4_ + auVar126._0_4_ + auVar128._0_4_ + auVar150._0_4_ +
             auVar123._0_4_ + auVar150._16_4_;
        auVar125._4_4_ =
             auVar127._4_4_ + auVar124._4_4_ + auVar126._4_4_ + auVar128._4_4_ + auVar150._4_4_ +
             auVar123._4_4_ + auVar150._20_4_;
        auVar125._8_4_ =
             auVar127._8_4_ + auVar124._8_4_ + auVar126._8_4_ + auVar128._8_4_ + auVar150._8_4_ +
             auVar123._8_4_ + auVar150._24_4_;
        auVar125._12_4_ =
             auVar127._12_4_ + auVar124._12_4_ + auVar126._12_4_ + auVar128._12_4_ + auVar150._12_4_
             + auVar123._12_4_ + auVar150._28_4_;
        switch(uVar101) {
        case 1:
          auVar82._12_4_ = 0;
          auVar82._0_12_ = ZEXT412(0);
          auVar125 = vmaxps_avx(auVar125,auVar82 << 0x20);
          break;
        case 2:
          auVar83._12_4_ = 0;
          auVar83._0_12_ = ZEXT412(0);
          auVar123 = vmaxps_avx(auVar125,auVar83 << 0x20);
          auVar125 = vminps_avx(auVar125,auVar83 << 0x20);
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
          auVar50._4_4_ = uVar7;
          auVar50._0_4_ = uVar7;
          auVar50._8_4_ = uVar7;
          auVar50._12_4_ = uVar7;
          auVar125 = vfmadd132ps_avx512vl(auVar125,auVar123,auVar50);
          break;
        case 3:
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
          auVar48._4_4_ = uVar7;
          auVar48._0_4_ = uVar7;
          auVar48._8_4_ = uVar7;
          auVar48._12_4_ = uVar7;
          auVar123 = vmaxps_avx512vl(auVar125,auVar48);
          uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var9))[1];
          auVar49._4_4_ = uVar7;
          auVar49._0_4_ = uVar7;
          auVar49._8_4_ = uVar7;
          auVar49._12_4_ = uVar7;
          auVar125 = vminps_avx512vl(auVar123,auVar49);
          break;
        case 4:
          auVar38._8_4_ = 0x80000000;
          auVar38._0_8_ = 0x8000000080000000;
          auVar38._12_4_ = 0x80000000;
          auVar123 = vxorps_avx512vl(auVar125,auVar38);
          auVar39._8_4_ = 0x42b0c0a5;
          auVar39._0_8_ = 0x42b0c0a542b0c0a5;
          auVar39._12_4_ = 0x42b0c0a5;
          auVar123 = vminps_avx512vl(auVar123,auVar39);
          auVar40._8_4_ = 0xc2b0c0a5;
          auVar40._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar40._12_4_ = 0xc2b0c0a5;
          auVar124 = vmaxps_avx512vl(auVar123,auVar40);
          auVar206._8_4_ = 0x3f000000;
          auVar206._0_8_ = 0x3f0000003f000000;
          auVar206._12_4_ = 0x3f000000;
          auVar219._8_4_ = 0x3fb8aa3b;
          auVar219._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar219._12_4_ = 0x3fb8aa3b;
          auVar125 = vfmadd213ps_fma(auVar219,auVar124,auVar206);
          auVar229._0_4_ = (int)auVar125._0_4_;
          auVar229._4_4_ = (int)auVar125._4_4_;
          auVar229._8_4_ = (int)auVar125._8_4_;
          auVar229._12_4_ = (int)auVar125._12_4_;
          auVar123 = vcvtdq2ps_avx(auVar229);
          auVar234._8_4_ = 0x3f800000;
          auVar234._0_8_ = 0x3f8000003f800000;
          auVar234._12_4_ = 0x3f800000;
          uVar102 = vcmpps_avx512vl(auVar125,auVar123,1);
          auVar125 = vsubps_avx512vl(auVar123,auVar234);
          bVar14 = (bool)((byte)uVar102 & 1);
          auVar148._0_4_ = (float)((uint)bVar14 * auVar125._0_4_ | (uint)!bVar14 * auVar123._0_4_);
          bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
          auVar148._4_4_ = (float)((uint)bVar14 * auVar125._4_4_ | (uint)!bVar14 * auVar123._4_4_);
          bVar14 = (bool)((byte)(uVar102 >> 2) & 1);
          auVar148._8_4_ = (float)((uint)bVar14 * auVar125._8_4_ | (uint)!bVar14 * auVar123._8_4_);
          bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
          auVar148._12_4_ =
               (float)((uint)bVar14 * auVar125._12_4_ | (uint)!bVar14 * auVar123._12_4_);
          auVar41._8_4_ = 0x3f318000;
          auVar41._0_8_ = 0x3f3180003f318000;
          auVar41._12_4_ = 0x3f318000;
          auVar123 = vfmsub231ps_avx512vl(auVar124,auVar148,auVar41);
          auVar42._8_4_ = 0x395e8083;
          auVar42._0_8_ = 0x395e8083395e8083;
          auVar42._12_4_ = 0x395e8083;
          auVar125 = vfmsub231ps_avx512vl(auVar123,auVar148,auVar42);
          auVar220._8_4_ = 0x39506967;
          auVar220._0_8_ = 0x3950696739506967;
          auVar220._12_4_ = 0x39506967;
          auVar43._8_4_ = 0x3ab743ce;
          auVar43._0_8_ = 0x3ab743ce3ab743ce;
          auVar43._12_4_ = 0x3ab743ce;
          auVar123 = vfmadd213ps_avx512vl(auVar220,auVar125,auVar43);
          auVar44._8_4_ = 0x3c088908;
          auVar44._0_8_ = 0x3c0889083c088908;
          auVar44._12_4_ = 0x3c088908;
          auVar123 = vfmadd213ps_avx512vl(auVar123,auVar125,auVar44);
          auVar45._8_4_ = 0x3d2aa9c1;
          auVar45._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar45._12_4_ = 0x3d2aa9c1;
          auVar123 = vfmadd213ps_avx512vl(auVar123,auVar125,auVar45);
          auVar46._8_4_ = 0x3e2aaaaa;
          auVar46._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar46._12_4_ = 0x3e2aaaaa;
          auVar123 = vfmadd213ps_avx512vl(auVar123,auVar125,auVar46);
          auVar238._0_4_ = auVar125._0_4_ * auVar125._0_4_;
          auVar238._4_4_ = auVar125._4_4_ * auVar125._4_4_;
          auVar238._8_4_ = auVar125._8_4_ * auVar125._8_4_;
          auVar238._12_4_ = auVar125._12_4_ * auVar125._12_4_;
          auVar123 = vfmadd213ps_fma(auVar123,auVar125,auVar206);
          auVar123 = vfmadd213ps_fma(auVar123,auVar238,auVar125);
          auVar207._0_4_ = auVar123._0_4_ + 1.0;
          auVar207._4_4_ = auVar123._4_4_ + 1.0;
          auVar207._8_4_ = auVar123._8_4_ + 1.0;
          auVar207._12_4_ = auVar123._12_4_ + 1.0;
          auVar202._0_4_ = (int)auVar148._0_4_;
          auVar202._4_4_ = (int)auVar148._4_4_;
          auVar202._8_4_ = (int)auVar148._8_4_;
          auVar202._12_4_ = (int)auVar148._12_4_;
          auVar123 = vpslld_avx(auVar202,0x17);
          auVar47._8_4_ = 0x3f800000;
          auVar47._0_8_ = 0x3f8000003f800000;
          auVar47._12_4_ = 0x3f800000;
          auVar123 = vpaddd_avx512vl(auVar123,auVar47);
          auVar125 = vfmadd213ps_fma(auVar123,auVar207,auVar234);
          auVar123 = vrcpps_avx(auVar125);
          auVar125 = vfmsub213ps_fma(auVar125,auVar123,auVar234);
          auVar125 = vfnmadd132ps_fma(auVar125,auVar123,auVar123);
          break;
        case 5:
          auVar241._8_4_ = 0x42b0c0a5;
          auVar241._0_8_ = 0x42b0c0a542b0c0a5;
          auVar241._12_4_ = 0x42b0c0a5;
          auVar123 = vminps_avx(auVar125,auVar241);
          auVar244._8_4_ = 0xc2b0c0a5;
          auVar244._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar244._12_4_ = 0xc2b0c0a5;
          auVar232._8_4_ = 0x3fb8aa3b;
          auVar232._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar232._12_4_ = 0x3fb8aa3b;
          auVar124 = vmaxps_avx(auVar123,auVar244);
          auVar216._8_4_ = 0x3f000000;
          auVar216._0_8_ = 0x3f0000003f000000;
          auVar216._12_4_ = 0x3f000000;
          auVar126 = vfmadd213ps_fma(auVar232,auVar124,auVar216);
          auVar226._0_4_ = (int)auVar126._0_4_;
          auVar226._4_4_ = (int)auVar126._4_4_;
          auVar226._8_4_ = (int)auVar126._8_4_;
          auVar226._12_4_ = (int)auVar126._12_4_;
          auVar123 = vcvtdq2ps_avx(auVar226);
          uVar102 = vcmpps_avx512vl(auVar126,auVar123,1);
          auVar205._8_4_ = 0x3f800000;
          auVar205._0_8_ = 0x3f8000003f800000;
          auVar205._12_4_ = 0x3f800000;
          auVar227._8_4_ = 0x3f318000;
          auVar227._0_8_ = 0x3f3180003f318000;
          auVar227._12_4_ = 0x3f318000;
          auVar126 = vsubps_avx512vl(auVar123,auVar205);
          bVar14 = (bool)((byte)uVar102 & 1);
          auVar143._0_4_ = (float)((uint)bVar14 * auVar126._0_4_ | (uint)!bVar14 * auVar123._0_4_);
          bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
          auVar143._4_4_ = (float)((uint)bVar14 * auVar126._4_4_ | (uint)!bVar14 * auVar123._4_4_);
          bVar14 = (bool)((byte)(uVar102 >> 2) & 1);
          auVar143._8_4_ = (float)((uint)bVar14 * auVar126._8_4_ | (uint)!bVar14 * auVar123._8_4_);
          bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
          auVar143._12_4_ =
               (float)((uint)bVar14 * auVar126._12_4_ | (uint)!bVar14 * auVar123._12_4_);
          auVar123 = vfmsub231ps_fma(auVar124,auVar143,auVar227);
          auVar247._8_4_ = 0xb95e8083;
          auVar247._0_8_ = 0xb95e8083b95e8083;
          auVar247._12_4_ = 0xb95e8083;
          auVar123 = vfnmsub231ps_fma(auVar123,auVar143,auVar247);
          auVar266._0_4_ = auVar123._0_4_ * auVar123._0_4_;
          auVar266._4_4_ = auVar123._4_4_ * auVar123._4_4_;
          auVar266._8_4_ = auVar123._8_4_ * auVar123._8_4_;
          auVar266._12_4_ = auVar123._12_4_ * auVar123._12_4_;
          auVar251._8_4_ = 0x3ab743ce;
          auVar251._0_8_ = 0x3ab743ce3ab743ce;
          auVar251._12_4_ = 0x3ab743ce;
          auVar237._8_4_ = 0x39506967;
          auVar237._0_8_ = 0x3950696739506967;
          auVar237._12_4_ = 0x39506967;
          auVar124 = vfmadd213ps_avx512vl(auVar237,auVar123,auVar251);
          auVar253._8_4_ = 0x3c088908;
          auVar253._0_8_ = 0x3c0889083c088908;
          auVar253._12_4_ = 0x3c088908;
          auVar255._8_4_ = 0x3d2aa9c1;
          auVar255._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar255._12_4_ = 0x3d2aa9c1;
          auVar124 = vfmadd213ps_avx512vl(auVar124,auVar123,auVar253);
          auVar124 = vfmadd213ps_avx512vl(auVar124,auVar123,auVar255);
          auVar257._8_4_ = 0x3e2aaaaa;
          auVar257._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar257._12_4_ = 0x3e2aaaaa;
          auVar124 = vfmadd213ps_avx512vl(auVar124,auVar123,auVar257);
          auVar124 = vfmadd213ps_avx512vl(auVar124,auVar123,auVar216);
          auVar124 = vfmadd213ps_avx512vl(auVar124,auVar266,auVar123);
          auVar126 = vaddps_avx512vl(auVar124,auVar205);
          auVar260._0_4_ = (int)auVar143._0_4_;
          auVar260._4_4_ = (int)auVar143._4_4_;
          auVar260._8_4_ = (int)auVar143._8_4_;
          auVar260._12_4_ = (int)auVar143._12_4_;
          auVar123 = vpslld_avx(auVar260,0x17);
          auVar261._8_4_ = 0x3f800000;
          auVar261._0_8_ = 0x3f8000003f800000;
          auVar261._12_4_ = 0x3f800000;
          auVar123 = vpaddd_avx(auVar123,auVar261);
          auVar123 = vfmadd213ps_fma(auVar123,auVar126,auVar205);
          auVar127._8_4_ = 0x800000;
          auVar127._0_8_ = 0x80000000800000;
          auVar127._12_4_ = 0x800000;
          auVar126 = vmaxps_avx512vl(auVar123,auVar127);
          auVar124 = vxorps_avx512vl(auVar124,auVar124);
          auVar127 = vpsrld_avx512vl(auVar126,0x17);
          auVar129 = vpbroadcastd_avx512vl(ZEXT416(0x3f000000));
          auVar128._8_4_ = 0x807fffff;
          auVar128._0_8_ = 0x807fffff807fffff;
          auVar128._12_4_ = 0x807fffff;
          auVar126 = vpternlogd_avx512vl(auVar129,auVar126,auVar128,0xf8);
          auVar129._8_4_ = 0xffffff82;
          auVar129._0_8_ = 0xffffff82ffffff82;
          auVar129._12_4_ = 0xffffff82;
          auVar127 = vpaddd_avx512vl(auVar127,auVar129);
          uVar102 = vcmpps_avx512vl(auVar123,auVar124,2);
          auVar123 = vcvtdq2ps_avx(auVar127);
          auVar130._8_4_ = 0x3f3504f3;
          auVar130._0_8_ = 0x3f3504f33f3504f3;
          auVar130._12_4_ = 0x3f3504f3;
          uVar16 = vcmpps_avx512vl(auVar126,auVar130,1);
          auVar201._8_4_ = 0xbf800000;
          auVar201._0_8_ = 0xbf800000bf800000;
          auVar201._12_4_ = 0xbf800000;
          auVar124 = vaddps_avx512vl(auVar126,auVar201);
          auVar127 = vsubps_avx512vl(auVar123,auVar205);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar144._0_4_ = (uint)bVar14 * auVar127._0_4_ | (uint)!bVar14 * auVar123._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar144._4_4_ = (uint)bVar14 * auVar127._4_4_ | (uint)!bVar14 * auVar123._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar144._8_4_ = (uint)bVar14 * auVar127._8_4_ | (uint)!bVar14 * auVar123._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar144._12_4_ = (uint)bVar14 * auVar127._12_4_ | (uint)!bVar14 * auVar123._12_4_;
          auVar123 = vaddps_avx512vl(auVar124,auVar126);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar145._0_4_ = (uint)bVar14 * auVar123._0_4_ | (uint)!bVar14 * auVar124._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar145._4_4_ = (uint)bVar14 * auVar123._4_4_ | (uint)!bVar14 * auVar124._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar145._8_4_ = (uint)bVar14 * auVar123._8_4_ | (uint)!bVar14 * auVar124._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar145._12_4_ = (uint)bVar14 * auVar123._12_4_ | (uint)!bVar14 * auVar124._12_4_;
          auVar123 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar135._8_4_ = 0xbdebd1b8;
          auVar135._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar135._12_4_ = 0xbdebd1b8;
          auVar123 = vfmadd213ps_avx512vl(auVar123,auVar145,auVar135);
          auVar131._8_4_ = 0x3def251a;
          auVar131._0_8_ = 0x3def251a3def251a;
          auVar131._12_4_ = 0x3def251a;
          auVar123 = vfmadd213ps_avx512vl(auVar123,auVar145,auVar131);
          auVar133._8_4_ = 0xbdfe5d4f;
          auVar133._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar133._12_4_ = 0xbdfe5d4f;
          auVar123 = vfmadd213ps_avx512vl(auVar123,auVar145,auVar133);
          auVar134._8_4_ = 0x3e11e9bf;
          auVar134._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar134._12_4_ = 0x3e11e9bf;
          auVar123 = vfmadd213ps_avx512vl(auVar123,auVar145,auVar134);
          auVar33._8_4_ = 0xbe2aae50;
          auVar33._0_8_ = 0xbe2aae50be2aae50;
          auVar33._12_4_ = 0xbe2aae50;
          auVar123 = vfmadd213ps_avx512vl(auVar123,auVar145,auVar33);
          auVar34._8_4_ = 0x3e4cceac;
          auVar34._0_8_ = 0x3e4cceac3e4cceac;
          auVar34._12_4_ = 0x3e4cceac;
          auVar123 = vfmadd213ps_avx512vl(auVar123,auVar145,auVar34);
          auVar35._8_4_ = 0xbe7ffffc;
          auVar35._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar35._12_4_ = 0xbe7ffffc;
          auVar123 = vfmadd213ps_avx512vl(auVar123,auVar145,auVar35);
          auVar124 = vmulps_avx512vl(auVar145,auVar145);
          auVar36._8_4_ = 0x3eaaaaaa;
          auVar36._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar36._12_4_ = 0x3eaaaaaa;
          auVar123 = vfmadd213ps_avx512vl(auVar123,auVar145,auVar36);
          auVar126 = vmulps_avx512vl(auVar124,auVar145);
          auVar123 = vmulps_avx512vl(auVar126,auVar123);
          auVar123 = vfmadd231ps_avx512vl(auVar123,auVar144,auVar247);
          auVar123 = vfmsub231ps_avx512vl(auVar123,auVar216,auVar124);
          auVar123 = vsubps_avx512vl(auVar123,auVar145);
          auVar123 = vfnmadd231ps_fma(auVar123,auVar227,auVar144);
          auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar14 = (bool)((byte)uVar102 & 1);
          auVar146._0_4_ =
               (uint)bVar14 * auVar124._0_4_ |
               (uint)!bVar14 * (int)(auVar123._0_4_ + auVar123._0_4_);
          bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
          auVar146._4_4_ =
               (uint)bVar14 * auVar124._4_4_ |
               (uint)!bVar14 * (int)(auVar123._4_4_ + auVar123._4_4_);
          bVar14 = (bool)((byte)(uVar102 >> 2) & 1);
          auVar146._8_4_ =
               (uint)bVar14 * auVar124._8_4_ |
               (uint)!bVar14 * (int)(auVar123._8_4_ + auVar123._8_4_);
          bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
          auVar146._12_4_ =
               (uint)bVar14 * auVar124._12_4_ |
               (uint)!bVar14 * (int)(auVar123._12_4_ + auVar123._12_4_);
          auVar123 = vminps_avx(auVar146,auVar241);
          auVar124 = vmaxps_avx(auVar123,auVar244);
          auVar126 = vfmadd213ps_fma(auVar232,auVar124,auVar216);
          auVar245._0_4_ = (int)auVar126._0_4_;
          auVar245._4_4_ = (int)auVar126._4_4_;
          auVar245._8_4_ = (int)auVar126._8_4_;
          auVar245._12_4_ = (int)auVar126._12_4_;
          auVar123 = vcvtdq2ps_avx(auVar245);
          uVar102 = vcmpps_avx512vl(auVar126,auVar123,1);
          auVar126 = vsubps_avx512vl(auVar123,auVar205);
          bVar14 = (bool)((byte)uVar102 & 1);
          auVar147._0_4_ = (float)((uint)bVar14 * auVar126._0_4_ | (uint)!bVar14 * auVar123._0_4_);
          bVar14 = (bool)((byte)(uVar102 >> 1) & 1);
          auVar147._4_4_ = (float)((uint)bVar14 * auVar126._4_4_ | (uint)!bVar14 * auVar123._4_4_);
          bVar14 = (bool)((byte)(uVar102 >> 2) & 1);
          auVar147._8_4_ = (float)((uint)bVar14 * auVar126._8_4_ | (uint)!bVar14 * auVar123._8_4_);
          bVar14 = (bool)((byte)(uVar102 >> 3) & 1);
          auVar147._12_4_ =
               (float)((uint)bVar14 * auVar126._12_4_ | (uint)!bVar14 * auVar123._12_4_);
          auVar123 = vfmsub213ps_fma(auVar227,auVar147,auVar124);
          auVar124 = vfnmsub231ps_fma(auVar123,auVar147,auVar247);
          auVar233._0_4_ = auVar124._0_4_ * auVar124._0_4_;
          auVar233._4_4_ = auVar124._4_4_ * auVar124._4_4_;
          auVar233._8_4_ = auVar124._8_4_ * auVar124._8_4_;
          auVar233._12_4_ = auVar124._12_4_ * auVar124._12_4_;
          auVar123 = vfmadd213ps_fma(auVar237,auVar124,auVar251);
          auVar123 = vfmadd213ps_fma(auVar123,auVar124,auVar253);
          auVar123 = vfmadd213ps_fma(auVar123,auVar124,auVar255);
          auVar123 = vfmadd213ps_fma(auVar123,auVar124,auVar257);
          auVar123 = vfmadd213ps_fma(auVar123,auVar124,auVar216);
          auVar123 = vfmadd213ps_fma(auVar123,auVar233,auVar124);
          auVar217._0_4_ = auVar123._0_4_ + 1.0;
          auVar217._4_4_ = auVar123._4_4_ + 1.0;
          auVar217._8_4_ = auVar123._8_4_ + 1.0;
          auVar217._12_4_ = auVar123._12_4_ + 1.0;
          auVar228._0_4_ = (int)auVar147._0_4_;
          auVar228._4_4_ = (int)auVar147._4_4_;
          auVar228._8_4_ = (int)auVar147._8_4_;
          auVar228._12_4_ = (int)auVar147._12_4_;
          auVar123 = vpslld_avx(auVar228,0x17);
          auVar123 = vpaddd_avx(auVar261,auVar123);
          auVar124 = vfmadd213ps_fma(auVar123,auVar217,auVar205);
          auVar123 = vrcpps_avx(auVar124);
          auVar218._0_4_ = auVar123._0_4_ + auVar123._0_4_;
          auVar218._4_4_ = auVar123._4_4_ + auVar123._4_4_;
          auVar218._8_4_ = auVar123._8_4_ + auVar123._8_4_;
          auVar218._12_4_ = auVar123._12_4_ + auVar123._12_4_;
          auVar37._8_4_ = 0x40000000;
          auVar37._0_8_ = 0x4000000040000000;
          auVar37._12_4_ = 0x40000000;
          auVar124 = vfmsub213ps_avx512vl(auVar124,auVar218,auVar37);
          auVar123 = vfnmadd213ps_fma(auVar124,auVar123,auVar218);
          auVar125 = vfmsub231ps_fma(auVar125,auVar125,auVar123);
          break;
        case 6:
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
          auVar126._4_4_ = uVar7;
          auVar126._0_4_ = uVar7;
          auVar126._8_4_ = uVar7;
          auVar126._12_4_ = uVar7;
          uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var9))[1];
          auVar123._4_4_ = uVar7;
          auVar123._0_4_ = uVar7;
          auVar123._8_4_ = uVar7;
          auVar123._12_4_ = uVar7;
          auVar123 = vfmadd213ps_avx512vl(auVar126,auVar125,auVar123);
          auVar123 = vmaxps_avx(auVar123,ZEXT816(0) << 0x20);
          auVar124._8_4_ = 0x3f800000;
          auVar124._0_8_ = 0x3f8000003f800000;
          auVar124._12_4_ = 0x3f800000;
          auVar123 = vminps_avx512vl(auVar123,auVar124);
          auVar125._0_4_ = auVar123._0_4_ * auVar125._0_4_;
          auVar125._4_4_ = auVar123._4_4_ * auVar125._4_4_;
          auVar125._8_4_ = auVar123._8_4_ * auVar125._8_4_;
          auVar125._12_4_ = auVar123._12_4_ * auVar125._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar103 * 4) = auVar125;
      }
      iVar100 = 0;
      iVar113 = (int)uVar103 + (uVar114 >> 2 & 1) * 4;
      local_d8 = this;
      if ((int)uVar114 <= iVar113) goto LAB_002b78ae;
      pvVar105 = (this->weight_data_tm).data;
      pfVar13 = *(float **)(&this->field_0xe8 + (long)p_Var9);
      pvVar12 = top_blob->data;
      local_138 = uVar121 & 0xfffffff8;
      uVar103 = (ulong)iVar113;
      auVar189 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar188 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        fVar200 = 0.0;
        if (lVar11 != 0) {
          fVar200 = *(float *)(lVar11 + uVar103 * 4);
        }
        pauVar110 = (undefined1 (*) [32])((long)pvVar105 + uVar103 * lVar115 * 4);
        pauVar104 = pauVar111;
        if ((int)uVar121 < 8) {
          auVar150 = SUB6432(ZEXT864(0),0);
          uVar114 = 0;
        }
        else {
          auVar190 = ZEXT864(0);
          iVar100 = 7;
          do {
            auVar123 = vfmadd231ps_fma(auVar190._0_32_,*pauVar104,*pauVar110);
            auVar190 = ZEXT1664(auVar123);
            auVar150 = ZEXT1632(auVar123);
            pauVar104 = pauVar104 + 1;
            pauVar110 = pauVar110 + 1;
            iVar100 = iVar100 + 8;
            uVar114 = local_138;
          } while (iVar100 < (int)uVar121);
        }
        auVar123 = ZEXT816(0) << 0x40;
        uVar117 = uVar114 | 3;
        while ((int)uVar117 < (int)uVar121) {
          auVar123 = vfmadd231ps_fma(auVar123,*(undefined1 (*) [16])*pauVar104,
                                     *(undefined1 (*) [16])*pauVar110);
          pauVar104 = (undefined1 (*) [32])(*pauVar104 + 0x10);
          pauVar110 = (undefined1 (*) [32])(*pauVar110 + 0x10);
          uVar117 = uVar114 + 7;
          uVar114 = uVar114 + 4;
        }
        if ((int)uVar114 < (int)uVar121) {
          auVar191 = vpbroadcastq_avx512f();
          uVar102 = 0;
          auVar190 = ZEXT1264(CONCAT84(SUB128(ZEXT812(0),4),fVar200));
          do {
            auVar193 = auVar190;
            auVar190 = vpbroadcastq_avx512f();
            auVar192 = vporq_avx512f(auVar190,auVar189);
            auVar190 = vporq_avx512f(auVar190,auVar188);
            uVar18 = vpcmpuq_avx512f(auVar190,auVar191,2);
            bVar15 = (byte)uVar18;
            uVar18 = vpcmpuq_avx512f(auVar192,auVar191,2);
            bVar81 = (byte)uVar18;
            uVar122 = CONCAT11(bVar81,bVar15);
            piVar10 = (int *)(*pauVar104 + uVar102 * 4);
            auVar190._4_4_ = (uint)((byte)(uVar122 >> 1) & 1) * piVar10[1];
            auVar190._0_4_ = (uint)(bVar15 & 1) * *piVar10;
            auVar190._8_4_ = (uint)((byte)(uVar122 >> 2) & 1) * piVar10[2];
            auVar190._12_4_ = (uint)((byte)(uVar122 >> 3) & 1) * piVar10[3];
            auVar190._16_4_ = (uint)((byte)(uVar122 >> 4) & 1) * piVar10[4];
            auVar190._20_4_ = (uint)((byte)(uVar122 >> 5) & 1) * piVar10[5];
            auVar190._24_4_ = (uint)((byte)(uVar122 >> 6) & 1) * piVar10[6];
            auVar190._28_4_ = (uint)((byte)(uVar122 >> 7) & 1) * piVar10[7];
            auVar190._32_4_ = (uint)(bVar81 & 1) * piVar10[8];
            auVar190._36_4_ = (uint)(bVar81 >> 1 & 1) * piVar10[9];
            auVar190._40_4_ = (uint)(bVar81 >> 2 & 1) * piVar10[10];
            auVar190._44_4_ = (uint)(bVar81 >> 3 & 1) * piVar10[0xb];
            auVar190._48_4_ = (uint)(bVar81 >> 4 & 1) * piVar10[0xc];
            auVar190._52_4_ = (uint)(bVar81 >> 5 & 1) * piVar10[0xd];
            auVar190._56_4_ = (uint)(bVar81 >> 6 & 1) * piVar10[0xe];
            auVar190._60_4_ = (uint)(bVar81 >> 7) * piVar10[0xf];
            piVar10 = (int *)(*pauVar110 + uVar102 * 4);
            auVar192._4_4_ = (uint)((byte)(uVar122 >> 1) & 1) * piVar10[1];
            auVar192._0_4_ = (uint)(bVar15 & 1) * *piVar10;
            auVar192._8_4_ = (uint)((byte)(uVar122 >> 2) & 1) * piVar10[2];
            auVar192._12_4_ = (uint)((byte)(uVar122 >> 3) & 1) * piVar10[3];
            auVar192._16_4_ = (uint)((byte)(uVar122 >> 4) & 1) * piVar10[4];
            auVar192._20_4_ = (uint)((byte)(uVar122 >> 5) & 1) * piVar10[5];
            auVar192._24_4_ = (uint)((byte)(uVar122 >> 6) & 1) * piVar10[6];
            auVar192._28_4_ = (uint)((byte)(uVar122 >> 7) & 1) * piVar10[7];
            auVar192._32_4_ = (uint)(bVar81 & 1) * piVar10[8];
            auVar192._36_4_ = (uint)(bVar81 >> 1 & 1) * piVar10[9];
            auVar192._40_4_ = (uint)(bVar81 >> 2 & 1) * piVar10[10];
            auVar192._44_4_ = (uint)(bVar81 >> 3 & 1) * piVar10[0xb];
            auVar192._48_4_ = (uint)(bVar81 >> 4 & 1) * piVar10[0xc];
            auVar192._52_4_ = (uint)(bVar81 >> 5 & 1) * piVar10[0xd];
            auVar192._56_4_ = (uint)(bVar81 >> 6 & 1) * piVar10[0xe];
            auVar192._60_4_ = (uint)(bVar81 >> 7) * piVar10[0xf];
            auVar190 = vfmadd213ps_avx512f(auVar192,auVar190,auVar193);
            uVar102 = uVar102 + 0x10;
          } while (((ulong)(~uVar114 + uVar121) + 0x10 & 0xfffffffffffffff0) != uVar102);
          auVar191._0_4_ =
               (uint)(bVar15 & 1) * auVar190._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar193._0_4_;
          bVar14 = (bool)((byte)(uVar122 >> 1) & 1);
          auVar191._4_4_ = (uint)bVar14 * auVar190._4_4_ | (uint)!bVar14 * auVar193._4_4_;
          bVar14 = (bool)((byte)(uVar122 >> 2) & 1);
          auVar191._8_4_ = (uint)bVar14 * auVar190._8_4_ | (uint)!bVar14 * auVar193._8_4_;
          bVar14 = (bool)((byte)(uVar122 >> 3) & 1);
          auVar191._12_4_ = (uint)bVar14 * auVar190._12_4_ | (uint)!bVar14 * auVar193._12_4_;
          bVar14 = (bool)((byte)(uVar122 >> 4) & 1);
          auVar191._16_4_ = (uint)bVar14 * auVar190._16_4_ | (uint)!bVar14 * auVar193._16_4_;
          bVar14 = (bool)((byte)(uVar122 >> 5) & 1);
          auVar191._20_4_ = (uint)bVar14 * auVar190._20_4_ | (uint)!bVar14 * auVar193._20_4_;
          bVar14 = (bool)((byte)(uVar122 >> 6) & 1);
          auVar191._24_4_ = (uint)bVar14 * auVar190._24_4_ | (uint)!bVar14 * auVar193._24_4_;
          bVar14 = (bool)((byte)(uVar122 >> 7) & 1);
          auVar191._28_4_ = (uint)bVar14 * auVar190._28_4_ | (uint)!bVar14 * auVar193._28_4_;
          auVar191._32_4_ =
               (uint)(bVar81 & 1) * auVar190._32_4_ | (uint)!(bool)(bVar81 & 1) * auVar193._32_4_;
          bVar14 = (bool)(bVar81 >> 1 & 1);
          auVar191._36_4_ = (uint)bVar14 * auVar190._36_4_ | (uint)!bVar14 * auVar193._36_4_;
          bVar14 = (bool)(bVar81 >> 2 & 1);
          auVar191._40_4_ = (uint)bVar14 * auVar190._40_4_ | (uint)!bVar14 * auVar193._40_4_;
          bVar14 = (bool)(bVar81 >> 3 & 1);
          auVar191._44_4_ = (uint)bVar14 * auVar190._44_4_ | (uint)!bVar14 * auVar193._44_4_;
          bVar14 = (bool)(bVar81 >> 4 & 1);
          auVar191._48_4_ = (uint)bVar14 * auVar190._48_4_ | (uint)!bVar14 * auVar193._48_4_;
          bVar14 = (bool)(bVar81 >> 5 & 1);
          auVar191._52_4_ = (uint)bVar14 * auVar190._52_4_ | (uint)!bVar14 * auVar193._52_4_;
          bVar14 = (bool)(bVar81 >> 6 & 1);
          auVar191._56_4_ = (uint)bVar14 * auVar190._56_4_ | (uint)!bVar14 * auVar193._56_4_;
          auVar191._60_4_ =
               (uint)(bVar81 >> 7) * auVar190._60_4_ | (uint)!(bool)(bVar81 >> 7) * auVar193._60_4_;
          auVar151 = vextractf64x4_avx512f(auVar191,1);
          auVar190 = vaddps_avx512f(auVar191,ZEXT3264(auVar151));
          auVar208._0_4_ = auVar190._0_4_ + auVar190._16_4_;
          auVar208._4_4_ = auVar190._4_4_ + auVar190._20_4_;
          auVar208._8_4_ = auVar190._8_4_ + auVar190._24_4_;
          auVar208._12_4_ = auVar190._12_4_ + auVar190._28_4_;
          auVar125 = vshufpd_avx(auVar208,auVar208,1);
          auVar209._0_4_ = auVar208._0_4_ + auVar125._0_4_;
          auVar209._4_4_ = auVar208._4_4_ + auVar125._4_4_;
          auVar209._8_4_ = auVar208._8_4_ + auVar125._8_4_;
          auVar209._12_4_ = auVar208._12_4_ + auVar125._12_4_;
          auVar125 = vhaddps_avx(auVar209,auVar209);
          fVar200 = auVar125._0_4_;
        }
        auVar203._0_4_ = auVar150._0_4_ + auVar150._16_4_ + auVar123._0_4_;
        auVar203._4_4_ = auVar150._4_4_ + auVar150._20_4_ + auVar123._4_4_;
        auVar203._8_4_ = auVar150._8_4_ + auVar150._24_4_ + auVar123._8_4_;
        auVar203._12_4_ = auVar150._12_4_ + auVar150._28_4_ + auVar123._12_4_;
        auVar123 = vhaddps_avx(auVar203,auVar203);
        auVar123 = vhaddps_avx(auVar123,auVar123);
        fVar200 = auVar123._0_4_ + fVar200;
        fVar199 = fVar200;
        if (uVar101 - 1 < 6) {
          auVar123 = ZEXT416((uint)fVar200);
          switch(uVar101) {
          case 1:
            auVar123 = vmaxss_avx(auVar123,ZEXT416(0));
            fVar199 = auVar123._0_4_;
            break;
          case 2:
            uVar18 = vcmpss_avx512f(auVar123,ZEXT416(0),0xe);
            bVar14 = (bool)((byte)uVar18 & 1);
            fVar199 = (float)((uint)bVar14 * 0x3f800000 + (uint)!bVar14 * (int)*pfVar13) * fVar200;
            break;
          case 3:
            auVar123 = vmaxss_avx(auVar123,ZEXT416((uint)*pfVar13));
            fVar199 = auVar123._0_4_;
            if (pfVar13[1] < auVar123._0_4_) {
              fVar199 = pfVar13[1];
            }
            break;
          case 4:
            auVar123 = vminss_avx(auVar123,SUB6416(ZEXT464(0x42b0c0a5),0));
            auVar52._8_4_ = 0x80000000;
            auVar52._0_8_ = 0x8000000080000000;
            auVar52._12_4_ = 0x80000000;
            auVar125 = vxorps_avx512vl(auVar123,auVar52);
            uVar18 = vcmpss_avx512f(auVar123,ZEXT416(0xc2b0c0a5),1);
            bVar14 = (bool)((byte)uVar18 & 1);
            fVar200 = expf((float)((uint)bVar14 * 0x42b0c0a5 + (uint)!bVar14 * auVar125._0_4_));
            auVar188 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar189 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            fVar199 = 1.0 / (fVar200 + 1.0);
            break;
          case 5:
            fVar199 = expf(fVar200);
            fVar199 = logf(fVar199 + 1.0);
            fVar199 = tanhf(fVar199);
            auVar188 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar189 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            fVar199 = fVar199 * fVar200;
            break;
          case 6:
            fVar8 = *pfVar13;
            auVar51._8_4_ = 0x80000000;
            auVar51._0_8_ = 0x8000000080000000;
            auVar51._12_4_ = 0x80000000;
            auVar123 = vxorps_avx512vl(ZEXT416((uint)pfVar13[1]),auVar51);
            fVar224 = auVar123._0_4_ / fVar8;
            fVar199 = 0.0;
            if ((fVar224 <= fVar200) && (fVar199 = fVar200, fVar200 <= fVar224 + 1.0 / fVar8)) {
              auVar123 = vfmadd213ss_fma(ZEXT416((uint)fVar8),ZEXT416((uint)fVar200),
                                         ZEXT416((uint)pfVar13[1]));
              fVar199 = auVar123._0_4_ * fVar200;
            }
          }
        }
        *(float *)((long)pvVar12 + uVar103 * 4) = fVar199;
        uVar103 = uVar103 + 1;
      } while (uVar103 != local_d0);
    }
    else if ((iVar100 == 4) && (0 < (int)uVar114)) {
      uVar102 = 0;
      auVar201 = ZEXT816(0) << 0x40;
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar225._8_4_ = 0xc2b0c0a5;
      auVar225._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar225._12_4_ = 0xc2b0c0a5;
      auVar231._8_4_ = 0x3f000000;
      auVar231._0_8_ = 0x3f0000003f000000;
      auVar231._12_4_ = 0x3f000000;
      auVar236._8_4_ = 0x3fb8aa3b;
      auVar236._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar236._12_4_ = 0x3fb8aa3b;
      auVar240._8_4_ = 0x3f800000;
      auVar240._0_8_ = 0x3f8000003f800000;
      auVar240._12_4_ = 0x3f800000;
      auVar243._8_4_ = 0x3f318000;
      auVar243._0_8_ = 0x3f3180003f318000;
      auVar243._12_4_ = 0x3f318000;
      auVar250._8_4_ = 0x39506967;
      auVar250._0_8_ = 0x3950696739506967;
      auVar250._12_4_ = 0x39506967;
      auVar252._8_4_ = 0x3ab743ce;
      auVar252._0_8_ = 0x3ab743ce3ab743ce;
      auVar252._12_4_ = 0x3ab743ce;
      auVar254._8_4_ = 0x3c088908;
      auVar254._0_8_ = 0x3c0889083c088908;
      auVar254._12_4_ = 0x3c088908;
      auVar256._8_4_ = 0x3d2aa9c1;
      auVar256._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar256._12_4_ = 0x3d2aa9c1;
      auVar259._8_4_ = 0x3e2aaaaa;
      auVar259._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar259._12_4_ = 0x3e2aaaaa;
      auVar263._8_4_ = 0x3f800000;
      auVar263._0_8_ = 0x3f8000003f800000;
      auVar263._12_4_ = 0x3f800000;
      auVar265._8_4_ = 0xb95e8083;
      auVar265._0_8_ = 0xb95e8083b95e8083;
      auVar265._12_4_ = 0xb95e8083;
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar127 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar128 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar129 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      do {
        auVar135 = ZEXT816(0) << 0x40;
        if (lVar11 != 0) {
          auVar135 = *(undefined1 (*) [16])(lVar11 + uVar102 * 0x10);
        }
        pauVar111 = (undefined1 (*) [32])
                    ((long)(this->weight_data_tm).w * uVar102 * (this->weight_data_tm).elemsize +
                    (long)(this->weight_data_tm).data);
        auVar131 = in_ZMM17._0_16_;
        auVar133 = in_ZMM18._0_16_;
        auVar132 = in_ZMM16._0_16_;
        pauVar110 = local_128;
        if ((int)uVar121 < 8) {
          auVar132 = vxorps_avx512vl(auVar132,auVar132);
          auVar150 = ZEXT1632(auVar132);
          auVar132 = vxorps_avx512vl(auVar133,auVar133);
          in_ZMM18 = ZEXT1664(auVar132);
          auVar132 = vxorps_avx512vl(auVar131,auVar131);
          in_ZMM17 = ZEXT1664(auVar132);
          auVar188 = ZEXT864(0);
          uVar114 = 0;
        }
        else {
          auVar188 = ZEXT864(0);
          iVar100 = 7;
          auVar131 = vxorps_avx512vl(auVar131,auVar131);
          in_ZMM17 = ZEXT1664(auVar131);
          auVar131 = vxorps_avx512vl(auVar133,auVar133);
          in_ZMM18 = ZEXT1664(auVar131);
          auVar132 = vxorps_avx512vl(auVar132,auVar132);
          auVar189 = ZEXT1664(auVar132);
          do {
            auVar132 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar110));
            auVar131 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar110 + 4)));
            auVar133 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar110 + 8)));
            auVar134 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar110 + 0xc)));
            auVar150 = vinsertf32x4_avx512vl(ZEXT1632(auVar132),auVar131,1);
            auVar151 = vinsertf32x4_avx512vl(ZEXT1632(auVar133),auVar134,1);
            auVar132 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar110 + 0x10)));
            auVar131 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar110 + 0x14)));
            auVar133 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar110 + 0x18)));
            auVar152 = vinsertf32x4_avx512vl(ZEXT1632(auVar132),auVar131,1);
            auVar132 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar110 + 0x1c)));
            auVar153 = vinsertf32x4_avx512vl(ZEXT1632(auVar133),auVar132,1);
            auVar150 = vfmadd231ps_avx512vl(auVar188._0_32_,auVar150,*pauVar111);
            auVar188 = ZEXT3264(auVar150);
            auVar150 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar151,pauVar111[1]);
            in_ZMM17 = ZEXT3264(auVar150);
            auVar150 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar152,pauVar111[2]);
            in_ZMM18 = ZEXT3264(auVar150);
            auVar150 = vfmadd231ps_avx512vl(auVar189._0_32_,auVar153,pauVar111[3]);
            auVar189 = ZEXT3264(auVar150);
            pauVar110 = pauVar110 + 1;
            pauVar111 = pauVar111 + 4;
            iVar100 = iVar100 + 8;
            uVar114 = uVar121 & 0xfffffff8;
          } while (iVar100 < (int)uVar121);
        }
        auVar151 = auVar188._0_32_;
        uVar117 = uVar114 | 3;
        while ((int)uVar117 < (int)uVar121) {
          auVar132 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar110));
          auVar131 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar110 + 4)));
          auVar133 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar110 + 8)));
          auVar134 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar110 + 0xc)));
          auVar151 = vinsertf32x4_avx512vl(ZEXT1632(auVar132),auVar131,1);
          auVar152 = vinsertf32x4_avx512vl(ZEXT1632(auVar133),auVar134,1);
          auVar151 = vfmadd231ps_avx512vl(auVar188._0_32_,auVar151,*pauVar111);
          auVar188 = ZEXT3264(auVar151);
          auVar152 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar152,pauVar111[1]);
          in_ZMM17 = ZEXT3264(auVar152);
          pauVar110 = (undefined1 (*) [32])(*pauVar110 + 0x10);
          pauVar111 = pauVar111 + 2;
          uVar117 = uVar114 + 7;
          uVar114 = uVar114 + 4;
        }
        if (uVar121 - uVar114 != 0 && (int)uVar114 <= (int)uVar121) {
          lVar115 = 0;
          do {
            auVar132 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar110 + lVar115 * 4)));
            auVar135 = vfmadd231ps_avx512vl(auVar135,auVar132,*(undefined1 (*) [16])*pauVar111);
            pauVar111 = (undefined1 (*) [32])(*pauVar111 + 0x10);
            lVar115 = lVar115 + 1;
          } while (uVar121 - uVar114 != (int)lVar115);
        }
        auVar150 = vaddps_avx512vl(in_ZMM18._0_32_,auVar150);
        auVar151 = vaddps_avx512vl(in_ZMM17._0_32_,auVar151);
        auVar150 = vaddps_avx512vl(auVar150,auVar151);
        auVar132 = vextractf32x4_avx512vl(auVar150,1);
        in_ZMM16 = ZEXT1664(auVar132);
        auVar132 = vaddps_avx512vl(auVar132,auVar150._0_16_);
        auVar141._0_4_ = auVar132._0_4_ + auVar135._0_4_;
        auVar141._4_4_ = auVar132._4_4_ + auVar135._4_4_;
        auVar141._8_4_ = auVar132._8_4_ + auVar135._8_4_;
        auVar141._12_4_ = auVar132._12_4_ + auVar135._12_4_;
        switch(uVar101) {
        case 1:
          auVar141 = vmaxps_avx(auVar141,auVar201);
          break;
        case 2:
          auVar135 = vmaxps_avx(auVar141,auVar201);
          auVar132 = vminps_avx(auVar141,auVar201);
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
          auVar32._4_4_ = uVar7;
          auVar32._0_4_ = uVar7;
          auVar32._8_4_ = uVar7;
          auVar32._12_4_ = uVar7;
          auVar141 = vfmadd132ps_avx512vl(auVar132,auVar135,auVar32);
          break;
        case 3:
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
          auVar30._4_4_ = uVar7;
          auVar30._0_4_ = uVar7;
          auVar30._8_4_ = uVar7;
          auVar30._12_4_ = uVar7;
          auVar135 = vmaxps_avx512vl(auVar141,auVar30);
          uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var9))[1];
          auVar31._4_4_ = uVar7;
          auVar31._0_4_ = uVar7;
          auVar31._8_4_ = uVar7;
          auVar31._12_4_ = uVar7;
          auVar141 = vminps_avx512vl(auVar135,auVar31);
          break;
        case 4:
          auVar28._8_4_ = 0x80000000;
          auVar28._0_8_ = 0x8000000080000000;
          auVar28._12_4_ = 0x80000000;
          auVar135 = vxorps_avx512vl(auVar141,auVar28);
          auVar135 = vminps_avx512vl(auVar135,auVar123);
          auVar135 = vmaxps_avx(auVar135,auVar225);
          auVar132 = vfmadd231ps_fma(auVar231,auVar135,auVar236);
          auVar131 = vcvttps2dq_avx512vl(auVar132);
          auVar131 = vcvtdq2ps_avx512vl(auVar131);
          uVar16 = vcmpps_avx512vl(auVar132,auVar131,1);
          auVar132 = vsubps_avx512vl(auVar131,auVar240);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar142._0_4_ = (uint)bVar14 * auVar132._0_4_ | (uint)!bVar14 * auVar131._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar142._4_4_ = (uint)bVar14 * auVar132._4_4_ | (uint)!bVar14 * auVar131._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar142._8_4_ = (uint)bVar14 * auVar132._8_4_ | (uint)!bVar14 * auVar131._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar142._12_4_ = (uint)bVar14 * auVar132._12_4_ | (uint)!bVar14 * auVar131._12_4_;
          in_ZMM16 = ZEXT1664(auVar142);
          auVar135 = vfmsub231ps_avx512vl(auVar135,auVar142,auVar243);
          auVar29._8_4_ = 0x395e8083;
          auVar29._0_8_ = 0x395e8083395e8083;
          auVar29._12_4_ = 0x395e8083;
          auVar135 = vfmsub231ps_avx512vl(auVar135,auVar142,auVar29);
          auVar246._0_4_ = auVar135._0_4_ * auVar135._0_4_;
          auVar246._4_4_ = auVar135._4_4_ * auVar135._4_4_;
          auVar246._8_4_ = auVar135._8_4_ * auVar135._8_4_;
          auVar246._12_4_ = auVar135._12_4_ * auVar135._12_4_;
          auVar132 = vfmadd213ps_avx512vl(auVar250,auVar135,auVar252);
          auVar132 = vfmadd213ps_avx512vl(auVar132,auVar135,auVar254);
          auVar132 = vfmadd213ps_avx512vl(auVar132,auVar135,auVar256);
          auVar132 = vfmadd213ps_avx512vl(auVar132,auVar135,auVar259);
          auVar132 = vfmadd213ps_avx512vl(auVar132,auVar135,auVar231);
          auVar135 = vfmadd213ps_avx512vl(auVar132,auVar246,auVar135);
          in_ZMM17 = ZEXT1664(auVar135);
          auVar132 = vaddps_avx512vl(auVar135,auVar240);
          auVar135 = vcvttps2dq_avx512vl(auVar142);
          auVar135 = vpslld_avx(auVar135,0x17);
          auVar135 = vpaddd_avx(auVar263,auVar135);
          auVar132 = vfmadd213ps_fma(auVar135,auVar132,auVar240);
          auVar135 = vrcpps_avx(auVar132);
          auVar132 = vfmsub213ps_fma(auVar132,auVar135,auVar240);
          auVar141 = vfnmadd132ps_fma(auVar132,auVar135,auVar135);
          break;
        case 5:
          auVar135 = vminps_avx512vl(auVar141,auVar123);
          auVar135 = vmaxps_avx(auVar135,auVar225);
          auVar132 = vfmadd213ps_avx512vl(auVar236,auVar135,auVar231);
          auVar131 = vcvttps2dq_avx512vl(auVar132);
          auVar131 = vcvtdq2ps_avx512vl(auVar131);
          uVar16 = vcmpps_avx512vl(auVar132,auVar131,1);
          auVar132 = vsubps_avx512vl(auVar131,auVar240);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar136._0_4_ = (uint)bVar14 * auVar132._0_4_ | (uint)!bVar14 * auVar131._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar136._4_4_ = (uint)bVar14 * auVar132._4_4_ | (uint)!bVar14 * auVar131._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar136._8_4_ = (uint)bVar14 * auVar132._8_4_ | (uint)!bVar14 * auVar131._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar136._12_4_ = (uint)bVar14 * auVar132._12_4_ | (uint)!bVar14 * auVar131._12_4_;
          auVar135 = vfmsub231ps_avx512vl(auVar135,auVar136,auVar243);
          auVar135 = vfnmsub231ps_avx512vl(auVar135,auVar136,auVar265);
          auVar132 = vmulps_avx512vl(auVar135,auVar135);
          auVar131 = vfmadd213ps_avx512vl(auVar250,auVar135,auVar252);
          auVar131 = vfmadd213ps_avx512vl(auVar131,auVar135,auVar254);
          auVar131 = vfmadd213ps_avx512vl(auVar131,auVar135,auVar256);
          auVar131 = vfmadd213ps_avx512vl(auVar131,auVar135,auVar259);
          auVar131 = vfmadd213ps_avx512vl(auVar131,auVar135,auVar231);
          auVar135 = vfmadd213ps_avx512vl(auVar131,auVar132,auVar135);
          auVar135 = vaddps_avx512vl(auVar135,auVar240);
          auVar132 = vcvttps2dq_avx512vl(auVar136);
          auVar132 = vpslld_avx512vl(auVar132,0x17);
          auVar132 = vpaddd_avx512vl(auVar132,auVar263);
          auVar135 = vfmadd213ps_avx512vl(auVar132,auVar135,auVar240);
          uVar16 = vcmpps_avx512vl(auVar135,auVar201,2);
          auVar20._8_4_ = 0x800000;
          auVar20._0_8_ = 0x80000000800000;
          auVar20._12_4_ = 0x800000;
          auVar135 = vmaxps_avx512vl(auVar135,auVar20);
          auVar132 = vpsrld_avx512vl(auVar135,0x17);
          auVar214._8_4_ = 0x807fffff;
          auVar214._0_8_ = 0x807fffff807fffff;
          auVar214._12_4_ = 0x807fffff;
          auVar21._8_4_ = 0x3f000000;
          auVar21._0_8_ = 0x3f0000003f000000;
          auVar21._12_4_ = 0x3f000000;
          auVar135 = vpternlogd_avx512vl(auVar135,auVar214,auVar21,0xea);
          auVar22._8_4_ = 0x3f3504f3;
          auVar22._0_8_ = 0x3f3504f33f3504f3;
          auVar22._12_4_ = 0x3f3504f3;
          uVar17 = vcmpps_avx512vl(auVar135,auVar22,1);
          auVar23._8_4_ = 0xbf800000;
          auVar23._0_8_ = 0xbf800000bf800000;
          auVar23._12_4_ = 0xbf800000;
          auVar131 = vaddps_avx512vl(auVar135,auVar23);
          auVar135 = vaddps_avx512vl(auVar131,auVar135);
          bVar14 = (bool)((byte)uVar17 & 1);
          auVar137._0_4_ = (uint)bVar14 * auVar135._0_4_ | (uint)!bVar14 * auVar131._0_4_;
          bVar14 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar137._4_4_ = (uint)bVar14 * auVar135._4_4_ | (uint)!bVar14 * auVar131._4_4_;
          bVar14 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar137._8_4_ = (uint)bVar14 * auVar135._8_4_ | (uint)!bVar14 * auVar131._8_4_;
          bVar14 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar137._12_4_ = (uint)bVar14 * auVar135._12_4_ | (uint)!bVar14 * auVar131._12_4_;
          auVar135 = vmulps_avx512vl(auVar137,auVar137);
          auVar24._8_4_ = 0xbdebd1b8;
          auVar24._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar24._12_4_ = 0xbdebd1b8;
          auVar131 = vfmadd213ps_avx512vl(auVar125,auVar137,auVar24);
          auVar25._8_4_ = 0x3def251a;
          auVar25._0_8_ = 0x3def251a3def251a;
          auVar25._12_4_ = 0x3def251a;
          auVar131 = vfmadd213ps_avx512vl(auVar131,auVar137,auVar25);
          auVar26._8_4_ = 0xbdfe5d4f;
          auVar26._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar26._12_4_ = 0xbdfe5d4f;
          auVar131 = vfmadd213ps_avx512vl(auVar131,auVar137,auVar26);
          auVar131 = vfmadd213ps_avx512vl(auVar131,auVar137,auVar124);
          auVar131 = vfmadd213ps_avx512vl(auVar131,auVar137,auVar126);
          auVar131 = vfmadd213ps_avx512vl(auVar131,auVar137,auVar127);
          auVar131 = vfmadd213ps_avx512vl(auVar131,auVar137,auVar128);
          auVar131 = vfmadd213ps_avx512vl(auVar131,auVar137,auVar129);
          auVar133 = vmulps_avx512vl(auVar135,auVar137);
          auVar131 = vmulps_avx512vl(auVar133,auVar131);
          auVar27._8_4_ = 0xffffff82;
          auVar27._0_8_ = 0xffffff82ffffff82;
          auVar27._12_4_ = 0xffffff82;
          auVar132 = vpaddd_avx512vl(auVar132,auVar27);
          auVar132 = vcvtdq2ps_avx512vl(auVar132);
          auVar133 = vsubps_avx512vl(auVar132,auVar240);
          bVar14 = (bool)((byte)uVar17 & 1);
          auVar138._0_4_ = (uint)bVar14 * auVar133._0_4_ | (uint)!bVar14 * auVar132._0_4_;
          bVar14 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar138._4_4_ = (uint)bVar14 * auVar133._4_4_ | (uint)!bVar14 * auVar132._4_4_;
          bVar14 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar138._8_4_ = (uint)bVar14 * auVar133._8_4_ | (uint)!bVar14 * auVar132._8_4_;
          bVar14 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar138._12_4_ = (uint)bVar14 * auVar133._12_4_ | (uint)!bVar14 * auVar132._12_4_;
          auVar132 = vfmadd231ps_avx512vl(auVar131,auVar138,auVar265);
          auVar135 = vfmsub231ps_avx512vl(auVar132,auVar231,auVar135);
          auVar135 = vsubps_avx512vl(auVar135,auVar137);
          auVar135 = vfnmadd231ps_avx512vl(auVar135,auVar243,auVar138);
          auVar132 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar139._0_4_ =
               (uint)bVar14 * auVar132._0_4_ |
               (uint)!bVar14 * (int)(auVar135._0_4_ + auVar135._0_4_);
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar139._4_4_ =
               (uint)bVar14 * auVar132._4_4_ |
               (uint)!bVar14 * (int)(auVar135._4_4_ + auVar135._4_4_);
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar139._8_4_ =
               (uint)bVar14 * auVar132._8_4_ |
               (uint)!bVar14 * (int)(auVar135._8_4_ + auVar135._8_4_);
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar139._12_4_ =
               (uint)bVar14 * auVar132._12_4_ |
               (uint)!bVar14 * (int)(auVar135._12_4_ + auVar135._12_4_);
          auVar135 = vminps_avx512vl(auVar139,auVar123);
          auVar135 = vmaxps_avx(auVar135,auVar225);
          auVar132 = vfmadd213ps_avx512vl(auVar236,auVar135,auVar231);
          auVar131 = vcvttps2dq_avx512vl(auVar132);
          auVar131 = vcvtdq2ps_avx512vl(auVar131);
          uVar16 = vcmpps_avx512vl(auVar132,auVar131,1);
          auVar132 = vsubps_avx512vl(auVar131,auVar240);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar140._0_4_ = (uint)bVar14 * auVar132._0_4_ | (uint)!bVar14 * auVar131._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar140._4_4_ = (uint)bVar14 * auVar132._4_4_ | (uint)!bVar14 * auVar131._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar140._8_4_ = (uint)bVar14 * auVar132._8_4_ | (uint)!bVar14 * auVar131._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar140._12_4_ = (uint)bVar14 * auVar132._12_4_ | (uint)!bVar14 * auVar131._12_4_;
          in_ZMM17 = ZEXT1664(auVar140);
          auVar135 = vfmsub231ps_avx512vl(auVar135,auVar140,auVar243);
          auVar135 = vfnmsub231ps_avx512vl(auVar135,auVar140,auVar265);
          auVar132 = vmulps_avx512vl(auVar135,auVar135);
          auVar131 = vfmadd213ps_avx512vl(auVar250,auVar135,auVar252);
          auVar131 = vfmadd213ps_avx512vl(auVar131,auVar135,auVar254);
          auVar131 = vfmadd213ps_avx512vl(auVar131,auVar135,auVar256);
          auVar131 = vfmadd213ps_avx512vl(auVar131,auVar135,auVar259);
          auVar131 = vfmadd213ps_avx512vl(auVar131,auVar135,auVar231);
          auVar135 = vfmadd213ps_avx512vl(auVar131,auVar132,auVar135);
          in_ZMM18 = ZEXT1664(auVar135);
          auVar135 = vaddps_avx512vl(auVar135,auVar240);
          auVar132 = vcvttps2dq_avx512vl(auVar140);
          auVar132 = vpslld_avx512vl(auVar132,0x17);
          auVar132 = vpaddd_avx512vl(auVar132,auVar263);
          auVar132 = vfmadd213ps_fma(auVar132,auVar135,auVar240);
          auVar135 = vrcpps_avx(auVar132);
          auVar131 = vaddps_avx512vl(auVar135,auVar135);
          in_ZMM16 = ZEXT1664(auVar131);
          auVar132 = vfmsub213ps_avx512vl(auVar132,auVar131,auVar130);
          auVar135 = vfnmadd213ps_avx512vl(auVar132,auVar135,auVar131);
          auVar141 = vfmsub231ps_fma(auVar141,auVar141,auVar135);
          break;
        case 6:
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
          auVar215._4_4_ = uVar7;
          auVar215._0_4_ = uVar7;
          auVar215._8_4_ = uVar7;
          auVar215._12_4_ = uVar7;
          uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var9))[1];
          auVar19._4_4_ = uVar7;
          auVar19._0_4_ = uVar7;
          auVar19._8_4_ = uVar7;
          auVar19._12_4_ = uVar7;
          auVar135 = vfmadd213ps_avx512vl(auVar215,auVar141,auVar19);
          auVar135 = vmaxps_avx(auVar135,auVar201);
          auVar135 = vminps_avx(auVar135,auVar240);
          auVar141._0_4_ = auVar135._0_4_ * auVar141._0_4_;
          auVar141._4_4_ = auVar135._4_4_ * auVar141._4_4_;
          auVar141._8_4_ = auVar135._8_4_ * auVar141._8_4_;
          auVar141._12_4_ = auVar135._12_4_ * auVar141._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar102 * 0x10) = auVar141;
        uVar102 = uVar102 + 1;
      } while (uVar102 != uVar103);
    }
  }
  else {
    if (iVar100 == 8) {
      if (0 < (int)uVar114) {
        uVar102 = 0;
        auVar150 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar169._8_4_ = 0xc2b0c0a5;
        auVar169._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar169._12_4_ = 0xc2b0c0a5;
        auVar169._16_4_ = 0xc2b0c0a5;
        auVar169._20_4_ = 0xc2b0c0a5;
        auVar169._24_4_ = 0xc2b0c0a5;
        auVar169._28_4_ = 0xc2b0c0a5;
        auVar170._8_4_ = 0x3f000000;
        auVar170._0_8_ = 0x3f0000003f000000;
        auVar170._12_4_ = 0x3f000000;
        auVar170._16_4_ = 0x3f000000;
        auVar170._20_4_ = 0x3f000000;
        auVar170._24_4_ = 0x3f000000;
        auVar170._28_4_ = 0x3f000000;
        auVar171._8_4_ = 0x3fb8aa3b;
        auVar171._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar171._12_4_ = 0x3fb8aa3b;
        auVar171._16_4_ = 0x3fb8aa3b;
        auVar171._20_4_ = 0x3fb8aa3b;
        auVar171._24_4_ = 0x3fb8aa3b;
        auVar171._28_4_ = 0x3fb8aa3b;
        auVar172._8_4_ = 0x3f800000;
        auVar172._0_8_ = 0x3f8000003f800000;
        auVar172._12_4_ = 0x3f800000;
        auVar172._16_4_ = 0x3f800000;
        auVar172._20_4_ = 0x3f800000;
        auVar172._24_4_ = 0x3f800000;
        auVar172._28_4_ = 0x3f800000;
        auVar173._8_4_ = 0x3f318000;
        auVar173._0_8_ = 0x3f3180003f318000;
        auVar173._12_4_ = 0x3f318000;
        auVar173._16_4_ = 0x3f318000;
        auVar173._20_4_ = 0x3f318000;
        auVar173._24_4_ = 0x3f318000;
        auVar173._28_4_ = 0x3f318000;
        auVar174._8_4_ = 0x39506967;
        auVar174._0_8_ = 0x3950696739506967;
        auVar174._12_4_ = 0x39506967;
        auVar174._16_4_ = 0x39506967;
        auVar174._20_4_ = 0x39506967;
        auVar174._24_4_ = 0x39506967;
        auVar174._28_4_ = 0x39506967;
        auVar175._8_4_ = 0x3ab743ce;
        auVar175._0_8_ = 0x3ab743ce3ab743ce;
        auVar175._12_4_ = 0x3ab743ce;
        auVar175._16_4_ = 0x3ab743ce;
        auVar175._20_4_ = 0x3ab743ce;
        auVar175._24_4_ = 0x3ab743ce;
        auVar175._28_4_ = 0x3ab743ce;
        auVar180._8_4_ = 0x3c088908;
        auVar180._0_8_ = 0x3c0889083c088908;
        auVar180._12_4_ = 0x3c088908;
        auVar180._16_4_ = 0x3c088908;
        auVar180._20_4_ = 0x3c088908;
        auVar180._24_4_ = 0x3c088908;
        auVar180._28_4_ = 0x3c088908;
        auVar176._8_4_ = 0x3d2aa9c1;
        auVar176._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar176._12_4_ = 0x3d2aa9c1;
        auVar176._16_4_ = 0x3d2aa9c1;
        auVar176._20_4_ = 0x3d2aa9c1;
        auVar176._24_4_ = 0x3d2aa9c1;
        auVar176._28_4_ = 0x3d2aa9c1;
        auVar177._8_4_ = 0x3e2aaaaa;
        auVar177._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar177._12_4_ = 0x3e2aaaaa;
        auVar177._16_4_ = 0x3e2aaaaa;
        auVar177._20_4_ = 0x3e2aaaaa;
        auVar177._24_4_ = 0x3e2aaaaa;
        auVar177._28_4_ = 0x3e2aaaaa;
        auVar178._8_4_ = 0x3f800000;
        auVar178._0_8_ = 0x3f8000003f800000;
        auVar178._12_4_ = 0x3f800000;
        auVar178._16_4_ = 0x3f800000;
        auVar178._20_4_ = 0x3f800000;
        auVar178._24_4_ = 0x3f800000;
        auVar178._28_4_ = 0x3f800000;
        auVar179._8_4_ = 0xb95e8083;
        auVar179._0_8_ = 0xb95e8083b95e8083;
        auVar179._12_4_ = 0xb95e8083;
        auVar179._16_4_ = 0xb95e8083;
        auVar179._20_4_ = 0xb95e8083;
        auVar179._24_4_ = 0xb95e8083;
        auVar179._28_4_ = 0xb95e8083;
        auVar151 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar152 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar153 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar154 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar125 = auVar154._0_16_;
        auVar155 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        do {
          auVar188 = ZEXT1664(ZEXT816(0) << 0x40);
          if (lVar11 != 0) {
            auVar188 = ZEXT3264(*(undefined1 (*) [32])(lVar11 + uVar102 * 0x20));
          }
          pauVar110 = (undefined1 (*) [32])
                      ((long)(this->weight_data_tm).w * uVar102 * (this->weight_data_tm).elemsize +
                      (long)(this->weight_data_tm).data);
          auVar124 = in_ZMM17._0_16_;
          auVar123 = in_ZMM16._0_16_;
          auVar128 = in_ZMM20._0_16_;
          auVar127 = in_ZMM19._0_16_;
          auVar129 = in_ZMM23._0_16_;
          auVar126 = in_ZMM18._0_16_;
          pauVar104 = local_128;
          if ((int)uVar121 < 8) {
            auVar126 = vxorps_avx512vl(auVar126,auVar126);
            auVar157 = ZEXT1632(auVar126);
            auVar126 = vxorps_avx512vl(auVar129,auVar129);
            in_ZMM23 = ZEXT1664(auVar126);
            auVar126 = vxorps_avx512vl(auVar127,auVar127);
            auVar156 = ZEXT1632(auVar126);
            auVar126 = vxorps_avx512vl(auVar128,auVar128);
            in_ZMM20 = ZEXT1664(auVar126);
            auVar123 = vxorps_avx512vl(auVar123,auVar123);
            auVar190 = ZEXT1664(auVar123);
            auVar123 = vxorps_avx512vl(auVar124,auVar124);
            in_ZMM17 = ZEXT1664(auVar123);
            auVar189 = ZEXT864(0);
            uVar117 = 0;
          }
          else {
            auVar189 = ZEXT864(0);
            iVar113 = 7;
            auVar124 = vxorps_avx512vl(auVar124,auVar124);
            in_ZMM17 = ZEXT1664(auVar124);
            auVar123 = vxorps_avx512vl(auVar123,auVar123);
            auVar190 = ZEXT1664(auVar123);
            auVar123 = vxorps_avx512vl(auVar128,auVar128);
            in_ZMM20 = ZEXT1664(auVar123);
            auVar123 = vxorps_avx512vl(auVar127,auVar127);
            auVar192 = ZEXT1664(auVar123);
            auVar123 = vxorps_avx512vl(auVar129,auVar129);
            in_ZMM23 = ZEXT1664(auVar123);
            auVar123 = vxorps_avx512vl(auVar126,auVar126);
            auVar191 = ZEXT1664(auVar123);
            do {
              auVar156 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar104));
              auVar157 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar104 + 4)));
              auVar158 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar104 + 8)));
              auVar159 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar104 + 0xc)));
              auVar156 = vfmadd231ps_avx512vl(auVar188._0_32_,auVar156,*pauVar110);
              auVar188 = ZEXT3264(auVar156);
              auVar156 = vfmadd231ps_avx512vl(auVar189._0_32_,auVar157,pauVar110[1]);
              auVar189 = ZEXT3264(auVar156);
              auVar156 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar158,pauVar110[2]);
              in_ZMM17 = ZEXT3264(auVar156);
              auVar156 = vfmadd231ps_avx512vl(auVar190._0_32_,auVar159,pauVar110[3]);
              auVar190 = ZEXT3264(auVar156);
              auVar156 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar104 + 0x10)));
              auVar157 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar104 + 0x14)));
              auVar158 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar104 + 0x18)));
              auVar159 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar104 + 0x1c)));
              auVar156 = vfmadd231ps_avx512vl(in_ZMM20._0_32_,auVar156,pauVar110[4]);
              in_ZMM20 = ZEXT3264(auVar156);
              auVar156 = vfmadd231ps_avx512vl(auVar192._0_32_,auVar157,pauVar110[5]);
              auVar192 = ZEXT3264(auVar156);
              auVar157 = vfmadd231ps_avx512vl(in_ZMM23._0_32_,auVar158,pauVar110[6]);
              in_ZMM23 = ZEXT3264(auVar157);
              auVar157 = vfmadd231ps_avx512vl(auVar191._0_32_,auVar159,pauVar110[7]);
              auVar191 = ZEXT3264(auVar157);
              pauVar104 = pauVar104 + 1;
              pauVar110 = pauVar110 + 8;
              iVar113 = iVar113 + 8;
              uVar117 = uVar121 & 0xfffffff8;
            } while (iVar113 < (int)uVar121);
          }
          auVar159 = auVar189._0_32_;
          auVar158 = auVar190._0_32_;
          uVar118 = uVar117 | 3;
          while( true ) {
            auVar162 = auVar188._0_32_;
            if ((int)uVar121 <= (int)uVar118) break;
            auVar158 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar104));
            auVar159 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar104 + 4)));
            auVar160 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar104 + 8)));
            auVar161 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar104 + 0xc)));
            auVar158 = vfmadd231ps_avx512vl(auVar162,auVar158,*pauVar110);
            auVar188 = ZEXT3264(auVar158);
            auVar159 = vfmadd231ps_avx512vl(auVar189._0_32_,auVar159,pauVar110[1]);
            auVar189 = ZEXT3264(auVar159);
            auVar158 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar160,pauVar110[2]);
            in_ZMM17 = ZEXT3264(auVar158);
            auVar158 = vfmadd231ps_avx512vl(auVar190._0_32_,auVar161,pauVar110[3]);
            auVar190 = ZEXT3264(auVar158);
            pauVar104 = (undefined1 (*) [32])(*pauVar104 + 0x10);
            pauVar110 = pauVar110 + 4;
            uVar118 = uVar117 + 7;
            uVar117 = uVar117 + 4;
          }
          if (uVar121 - uVar117 != 0 && (int)uVar117 <= (int)uVar121) {
            lVar115 = 0;
            do {
              auVar162 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar104 + lVar115 * 4)));
              auVar162 = vfmadd231ps_avx512vl(auVar188._0_32_,auVar162,*pauVar110);
              auVar188 = ZEXT3264(auVar162);
              pauVar110 = pauVar110 + 1;
              lVar115 = lVar115 + 1;
            } while (uVar121 - uVar117 != (int)lVar115);
          }
          auVar157 = vaddps_avx512vl(in_ZMM23._0_32_,auVar157);
          auVar156 = vaddps_avx512vl(auVar156,in_ZMM20._0_32_);
          in_ZMM19 = ZEXT3264(auVar156);
          auVar156 = vaddps_avx512vl(auVar157,auVar156);
          in_ZMM18 = ZEXT3264(auVar156);
          auVar157 = vaddps_avx512vl(auVar158,in_ZMM17._0_32_);
          in_ZMM16 = ZEXT3264(auVar157);
          auVar157 = vaddps_avx512vl(auVar157,auVar159);
          auVar157 = vaddps_avx512vl(auVar156,auVar157);
          auVar156._0_4_ = auVar157._0_4_ + auVar162._0_4_;
          auVar156._4_4_ = auVar157._4_4_ + auVar162._4_4_;
          auVar156._8_4_ = auVar157._8_4_ + auVar162._8_4_;
          auVar156._12_4_ = auVar157._12_4_ + auVar162._12_4_;
          auVar156._16_4_ = auVar157._16_4_ + auVar162._16_4_;
          auVar156._20_4_ = auVar157._20_4_ + auVar162._20_4_;
          auVar156._24_4_ = auVar157._24_4_ + auVar162._24_4_;
          auVar156._28_4_ = auVar157._28_4_ + auVar162._28_4_;
          if (5 < uVar101 - 1) goto LAB_002b623a;
          auVar157 = ZEXT1632(ZEXT816(0) << 0x40);
          switch(uVar101) {
          case 1:
            auVar156 = vmaxps_avx(auVar156,ZEXT1632(ZEXT816(0) << 0x40));
            break;
          case 2:
            auVar158 = vmaxps_avx(auVar156,auVar157);
            auVar156 = vminps_avx(auVar156,auVar157);
            uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
            auVar63._4_4_ = uVar7;
            auVar63._0_4_ = uVar7;
            auVar63._8_4_ = uVar7;
            auVar63._12_4_ = uVar7;
            auVar63._16_4_ = uVar7;
            auVar63._20_4_ = uVar7;
            auVar63._24_4_ = uVar7;
            auVar63._28_4_ = uVar7;
            auVar156 = vfmadd132ps_avx512vl(auVar156,auVar158,auVar63);
            break;
          case 3:
            uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
            auVar61._4_4_ = uVar7;
            auVar61._0_4_ = uVar7;
            auVar61._8_4_ = uVar7;
            auVar61._12_4_ = uVar7;
            auVar61._16_4_ = uVar7;
            auVar61._20_4_ = uVar7;
            auVar61._24_4_ = uVar7;
            auVar61._28_4_ = uVar7;
            auVar156 = vmaxps_avx512vl(auVar156,auVar61);
            uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var9))[1];
            auVar62._4_4_ = uVar7;
            auVar62._0_4_ = uVar7;
            auVar62._8_4_ = uVar7;
            auVar62._12_4_ = uVar7;
            auVar62._16_4_ = uVar7;
            auVar62._20_4_ = uVar7;
            auVar62._24_4_ = uVar7;
            auVar62._28_4_ = uVar7;
            auVar156 = vminps_avx512vl(auVar156,auVar62);
            break;
          case 4:
            auVar59._8_4_ = 0x80000000;
            auVar59._0_8_ = 0x8000000080000000;
            auVar59._12_4_ = 0x80000000;
            auVar59._16_4_ = 0x80000000;
            auVar59._20_4_ = 0x80000000;
            auVar59._24_4_ = 0x80000000;
            auVar59._28_4_ = 0x80000000;
            auVar156 = vxorps_avx512vl(auVar156,auVar59);
            auVar156 = vminps_avx512vl(auVar156,auVar150);
            auVar156 = vmaxps_avx(auVar156,auVar169);
            auVar123 = vfmadd231ps_fma(auVar170,auVar156,auVar171);
            auVar157 = vrndscaleps_avx512vl(ZEXT1632(auVar123),1);
            uVar16 = vcmpps_avx512vl(ZEXT1632(auVar123),auVar157,1);
            auVar158 = vsubps_avx512vl(auVar157,auVar172);
            bVar14 = (bool)((byte)uVar16 & 1);
            auVar168._0_4_ = (uint)bVar14 * auVar158._0_4_ | (uint)!bVar14 * auVar157._0_4_;
            bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
            auVar168._4_4_ = (uint)bVar14 * auVar158._4_4_ | (uint)!bVar14 * auVar157._4_4_;
            bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
            auVar168._8_4_ = (uint)bVar14 * auVar158._8_4_ | (uint)!bVar14 * auVar157._8_4_;
            bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
            auVar168._12_4_ = (uint)bVar14 * auVar158._12_4_ | (uint)!bVar14 * auVar157._12_4_;
            bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
            auVar168._16_4_ = (uint)bVar14 * auVar158._16_4_ | (uint)!bVar14 * auVar157._16_4_;
            bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
            auVar168._20_4_ = (uint)bVar14 * auVar158._20_4_ | (uint)!bVar14 * auVar157._20_4_;
            bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
            auVar168._24_4_ = (uint)bVar14 * auVar158._24_4_ | (uint)!bVar14 * auVar157._24_4_;
            bVar14 = SUB81(uVar16 >> 7,0);
            auVar168._28_4_ = (uint)bVar14 * auVar158._28_4_ | (uint)!bVar14 * auVar157._28_4_;
            in_ZMM16 = ZEXT3264(auVar168);
            auVar156 = vfmsub231ps_avx512vl(auVar156,auVar168,auVar173);
            auVar60._8_4_ = 0x395e8083;
            auVar60._0_8_ = 0x395e8083395e8083;
            auVar60._12_4_ = 0x395e8083;
            auVar60._16_4_ = 0x395e8083;
            auVar60._20_4_ = 0x395e8083;
            auVar60._24_4_ = 0x395e8083;
            auVar60._28_4_ = 0x395e8083;
            auVar156 = vfmsub231ps_avx512vl(auVar156,auVar168,auVar60);
            auVar248._0_4_ = auVar156._0_4_ * auVar156._0_4_;
            auVar248._4_4_ = auVar156._4_4_ * auVar156._4_4_;
            auVar248._8_4_ = auVar156._8_4_ * auVar156._8_4_;
            auVar248._12_4_ = auVar156._12_4_ * auVar156._12_4_;
            auVar248._16_4_ = auVar156._16_4_ * auVar156._16_4_;
            auVar248._20_4_ = auVar156._20_4_ * auVar156._20_4_;
            auVar248._24_4_ = auVar156._24_4_ * auVar156._24_4_;
            auVar248._28_4_ = 0;
            auVar157 = vfmadd213ps_avx512vl(auVar174,auVar156,auVar175);
            auVar157 = vfmadd213ps_avx512vl(auVar157,auVar156,auVar180);
            auVar157 = vfmadd213ps_avx512vl(auVar157,auVar156,auVar176);
            auVar157 = vfmadd213ps_avx512vl(auVar157,auVar156,auVar177);
            auVar157 = vfmadd213ps_avx512vl(auVar157,auVar156,auVar170);
            auVar156 = vfmadd213ps_avx512vl(auVar157,auVar248,auVar156);
            in_ZMM17 = ZEXT3264(auVar156);
            auVar157 = vaddps_avx512vl(auVar156,auVar172);
            auVar156 = vcvttps2dq_avx512vl(auVar168);
            auVar156 = vpslld_avx2(auVar156,0x17);
            auVar156 = vpaddd_avx2(auVar178,auVar156);
            auVar123 = vfmadd213ps_fma(auVar156,auVar157,auVar172);
            auVar156 = vrcpps_avx(ZEXT1632(auVar123));
            auVar123 = vfmsub213ps_fma(ZEXT1632(auVar123),auVar156,auVar172);
            auVar123 = vfnmadd132ps_fma(ZEXT1632(auVar123),auVar156,auVar156);
            auVar156 = ZEXT1632(auVar123);
            break;
          case 5:
            auVar158 = vminps_avx512vl(auVar156,auVar150);
            auVar158 = vmaxps_avx(auVar158,auVar169);
            auVar159 = vfmadd213ps_avx512vl(auVar171,auVar158,auVar170);
            auVar162 = vrndscaleps_avx512vl(auVar159,1);
            uVar16 = vcmpps_avx512vl(auVar159,auVar162,1);
            auVar159 = vsubps_avx512vl(auVar162,auVar172);
            bVar14 = (bool)((byte)uVar16 & 1);
            auVar163._0_4_ = (uint)bVar14 * auVar159._0_4_ | (uint)!bVar14 * auVar162._0_4_;
            bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
            auVar163._4_4_ = (uint)bVar14 * auVar159._4_4_ | (uint)!bVar14 * auVar162._4_4_;
            bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
            auVar163._8_4_ = (uint)bVar14 * auVar159._8_4_ | (uint)!bVar14 * auVar162._8_4_;
            bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
            auVar163._12_4_ = (uint)bVar14 * auVar159._12_4_ | (uint)!bVar14 * auVar162._12_4_;
            bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
            auVar163._16_4_ = (uint)bVar14 * auVar159._16_4_ | (uint)!bVar14 * auVar162._16_4_;
            bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
            auVar163._20_4_ = (uint)bVar14 * auVar159._20_4_ | (uint)!bVar14 * auVar162._20_4_;
            bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
            auVar163._24_4_ = (uint)bVar14 * auVar159._24_4_ | (uint)!bVar14 * auVar162._24_4_;
            bVar14 = SUB81(uVar16 >> 7,0);
            auVar163._28_4_ = (uint)bVar14 * auVar159._28_4_ | (uint)!bVar14 * auVar162._28_4_;
            auVar158 = vfmsub231ps_avx512vl(auVar158,auVar163,auVar173);
            auVar158 = vfnmsub231ps_avx512vl(auVar158,auVar163,auVar179);
            auVar159 = vmulps_avx512vl(auVar158,auVar158);
            auVar162 = vfmadd213ps_avx512vl(auVar174,auVar158,auVar175);
            auVar162 = vfmadd213ps_avx512vl(auVar162,auVar158,auVar180);
            auVar162 = vfmadd213ps_avx512vl(auVar162,auVar158,auVar176);
            auVar162 = vfmadd213ps_avx512vl(auVar162,auVar158,auVar177);
            auVar162 = vfmadd213ps_avx512vl(auVar162,auVar158,auVar170);
            auVar158 = vfmadd213ps_avx512vl(auVar162,auVar159,auVar158);
            auVar158 = vaddps_avx512vl(auVar158,auVar172);
            auVar159 = vcvttps2dq_avx512vl(auVar163);
            auVar159 = vpslld_avx512vl(auVar159,0x17);
            auVar159 = vpaddd_avx512vl(auVar159,auVar178);
            auVar158 = vfmadd213ps_avx512vl(auVar159,auVar158,auVar172);
            uVar16 = vcmpps_avx512vl(auVar158,auVar157,2);
            auVar157._8_4_ = 0x800000;
            auVar157._0_8_ = 0x80000000800000;
            auVar157._12_4_ = 0x800000;
            auVar157._16_4_ = 0x800000;
            auVar157._20_4_ = 0x800000;
            auVar157._24_4_ = 0x800000;
            auVar157._28_4_ = 0x800000;
            auVar157 = vmaxps_avx512vl(auVar158,auVar157);
            auVar158 = vpsrld_avx512vl(auVar157,0x17);
            auVar221._8_4_ = 0x807fffff;
            auVar221._0_8_ = 0x807fffff807fffff;
            auVar221._12_4_ = 0x807fffff;
            auVar221._16_4_ = 0x807fffff;
            auVar221._20_4_ = 0x807fffff;
            auVar221._24_4_ = 0x807fffff;
            auVar221._28_4_ = 0x807fffff;
            auVar162._8_4_ = 0x3f000000;
            auVar162._0_8_ = 0x3f0000003f000000;
            auVar162._12_4_ = 0x3f000000;
            auVar162._16_4_ = 0x3f000000;
            auVar162._20_4_ = 0x3f000000;
            auVar162._24_4_ = 0x3f000000;
            auVar162._28_4_ = 0x3f000000;
            auVar157 = vpternlogd_avx512vl(auVar157,auVar221,auVar162,0xea);
            auVar160._8_4_ = 0x3f3504f3;
            auVar160._0_8_ = 0x3f3504f33f3504f3;
            auVar160._12_4_ = 0x3f3504f3;
            auVar160._16_4_ = 0x3f3504f3;
            auVar160._20_4_ = 0x3f3504f3;
            auVar160._24_4_ = 0x3f3504f3;
            auVar160._28_4_ = 0x3f3504f3;
            uVar17 = vcmpps_avx512vl(auVar157,auVar160,1);
            auVar159 = vaddps_avx512vl(auVar157,auVar151);
            auVar157 = vaddps_avx512vl(auVar159,auVar157);
            bVar14 = (bool)((byte)uVar17 & 1);
            auVar164._0_4_ = (uint)bVar14 * auVar157._0_4_ | (uint)!bVar14 * auVar159._0_4_;
            bVar14 = (bool)((byte)(uVar17 >> 1) & 1);
            auVar164._4_4_ = (uint)bVar14 * auVar157._4_4_ | (uint)!bVar14 * auVar159._4_4_;
            bVar14 = (bool)((byte)(uVar17 >> 2) & 1);
            auVar164._8_4_ = (uint)bVar14 * auVar157._8_4_ | (uint)!bVar14 * auVar159._8_4_;
            bVar14 = (bool)((byte)(uVar17 >> 3) & 1);
            auVar164._12_4_ = (uint)bVar14 * auVar157._12_4_ | (uint)!bVar14 * auVar159._12_4_;
            bVar14 = (bool)((byte)(uVar17 >> 4) & 1);
            auVar164._16_4_ = (uint)bVar14 * auVar157._16_4_ | (uint)!bVar14 * auVar159._16_4_;
            bVar14 = (bool)((byte)(uVar17 >> 5) & 1);
            auVar164._20_4_ = (uint)bVar14 * auVar157._20_4_ | (uint)!bVar14 * auVar159._20_4_;
            bVar14 = (bool)((byte)(uVar17 >> 6) & 1);
            auVar164._24_4_ = (uint)bVar14 * auVar157._24_4_ | (uint)!bVar14 * auVar159._24_4_;
            bVar14 = SUB81(uVar17 >> 7,0);
            auVar164._28_4_ = (uint)bVar14 * auVar157._28_4_ | (uint)!bVar14 * auVar159._28_4_;
            auVar157 = vmulps_avx512vl(auVar164,auVar164);
            auVar159 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
            auVar161._8_4_ = 0xbdebd1b8;
            auVar161._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar161._12_4_ = 0xbdebd1b8;
            auVar161._16_4_ = 0xbdebd1b8;
            auVar161._20_4_ = 0xbdebd1b8;
            auVar161._24_4_ = 0xbdebd1b8;
            auVar161._28_4_ = 0xbdebd1b8;
            auVar159 = vfmadd213ps_avx512vl(auVar159,auVar164,auVar161);
            auVar54._8_4_ = 0x3def251a;
            auVar54._0_8_ = 0x3def251a3def251a;
            auVar54._12_4_ = 0x3def251a;
            auVar54._16_4_ = 0x3def251a;
            auVar54._20_4_ = 0x3def251a;
            auVar54._24_4_ = 0x3def251a;
            auVar54._28_4_ = 0x3def251a;
            auVar159 = vfmadd213ps_avx512vl(auVar159,auVar164,auVar54);
            auVar55._8_4_ = 0xbdfe5d4f;
            auVar55._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar55._12_4_ = 0xbdfe5d4f;
            auVar55._16_4_ = 0xbdfe5d4f;
            auVar55._20_4_ = 0xbdfe5d4f;
            auVar55._24_4_ = 0xbdfe5d4f;
            auVar55._28_4_ = 0xbdfe5d4f;
            auVar159 = vfmadd213ps_avx512vl(auVar159,auVar164,auVar55);
            auVar56._8_4_ = 0x3e11e9bf;
            auVar56._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar56._12_4_ = 0x3e11e9bf;
            auVar56._16_4_ = 0x3e11e9bf;
            auVar56._20_4_ = 0x3e11e9bf;
            auVar56._24_4_ = 0x3e11e9bf;
            auVar56._28_4_ = 0x3e11e9bf;
            auVar159 = vfmadd213ps_avx512vl(auVar159,auVar164,auVar56);
            auVar57._8_4_ = 0xbe2aae50;
            auVar57._0_8_ = 0xbe2aae50be2aae50;
            auVar57._12_4_ = 0xbe2aae50;
            auVar57._16_4_ = 0xbe2aae50;
            auVar57._20_4_ = 0xbe2aae50;
            auVar57._24_4_ = 0xbe2aae50;
            auVar57._28_4_ = 0xbe2aae50;
            auVar159 = vfmadd213ps_avx512vl(auVar159,auVar164,auVar57);
            auVar159 = vfmadd213ps_avx512vl(auVar159,auVar164,auVar152);
            auVar159 = vfmadd213ps_avx512vl(auVar159,auVar164,auVar153);
            auVar159 = vfmadd213ps_avx512vl(auVar159,auVar164,auVar154);
            auVar162 = vmulps_avx512vl(auVar157,auVar164);
            in_ZMM19 = ZEXT3264(auVar162);
            auVar159 = vmulps_avx512vl(auVar162,auVar159);
            auVar58._8_4_ = 0xffffff82;
            auVar58._0_8_ = 0xffffff82ffffff82;
            auVar58._12_4_ = 0xffffff82;
            auVar58._16_4_ = 0xffffff82;
            auVar58._20_4_ = 0xffffff82;
            auVar58._24_4_ = 0xffffff82;
            auVar58._28_4_ = 0xffffff82;
            auVar158 = vpaddd_avx512vl(auVar158,auVar58);
            auVar158 = vcvtdq2ps_avx512vl(auVar158);
            auVar162 = vsubps_avx512vl(auVar158,auVar172);
            bVar14 = (bool)((byte)uVar17 & 1);
            auVar165._0_4_ = (uint)bVar14 * auVar162._0_4_ | (uint)!bVar14 * auVar158._0_4_;
            bVar14 = (bool)((byte)(uVar17 >> 1) & 1);
            auVar165._4_4_ = (uint)bVar14 * auVar162._4_4_ | (uint)!bVar14 * auVar158._4_4_;
            bVar14 = (bool)((byte)(uVar17 >> 2) & 1);
            auVar165._8_4_ = (uint)bVar14 * auVar162._8_4_ | (uint)!bVar14 * auVar158._8_4_;
            bVar14 = (bool)((byte)(uVar17 >> 3) & 1);
            auVar165._12_4_ = (uint)bVar14 * auVar162._12_4_ | (uint)!bVar14 * auVar158._12_4_;
            bVar14 = (bool)((byte)(uVar17 >> 4) & 1);
            auVar165._16_4_ = (uint)bVar14 * auVar162._16_4_ | (uint)!bVar14 * auVar158._16_4_;
            bVar14 = (bool)((byte)(uVar17 >> 5) & 1);
            auVar165._20_4_ = (uint)bVar14 * auVar162._20_4_ | (uint)!bVar14 * auVar158._20_4_;
            bVar14 = (bool)((byte)(uVar17 >> 6) & 1);
            auVar165._24_4_ = (uint)bVar14 * auVar162._24_4_ | (uint)!bVar14 * auVar158._24_4_;
            bVar14 = SUB81(uVar17 >> 7,0);
            auVar165._28_4_ = (uint)bVar14 * auVar162._28_4_ | (uint)!bVar14 * auVar158._28_4_;
            auVar158 = vfmadd231ps_avx512vl(auVar159,auVar165,auVar179);
            auVar157 = vfmsub231ps_avx512vl(auVar158,auVar170,auVar157);
            auVar157 = vsubps_avx512vl(auVar157,auVar164);
            auVar157 = vfmsub231ps_avx512vl(auVar157,auVar173,auVar165);
            auVar157 = vmulps_avx512vl(auVar157,auVar155);
            auVar158 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar14 = (bool)((byte)uVar16 & 1);
            auVar166._0_4_ = (uint)bVar14 * auVar158._0_4_ | (uint)!bVar14 * auVar157._0_4_;
            bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
            auVar166._4_4_ = (uint)bVar14 * auVar158._4_4_ | (uint)!bVar14 * auVar157._4_4_;
            bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
            auVar166._8_4_ = (uint)bVar14 * auVar158._8_4_ | (uint)!bVar14 * auVar157._8_4_;
            bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
            auVar166._12_4_ = (uint)bVar14 * auVar158._12_4_ | (uint)!bVar14 * auVar157._12_4_;
            bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
            auVar166._16_4_ = (uint)bVar14 * auVar158._16_4_ | (uint)!bVar14 * auVar157._16_4_;
            bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
            auVar166._20_4_ = (uint)bVar14 * auVar158._20_4_ | (uint)!bVar14 * auVar157._20_4_;
            bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
            auVar166._24_4_ = (uint)bVar14 * auVar158._24_4_ | (uint)!bVar14 * auVar157._24_4_;
            bVar14 = SUB81(uVar16 >> 7,0);
            auVar166._28_4_ = (uint)bVar14 * auVar158._28_4_ | (uint)!bVar14 * auVar157._28_4_;
            auVar157 = vminps_avx512vl(auVar166,auVar150);
            auVar157 = vmaxps_avx(auVar157,auVar169);
            auVar158 = vfmadd213ps_avx512vl(auVar171,auVar157,auVar170);
            auVar159 = vrndscaleps_avx512vl(auVar158,1);
            uVar16 = vcmpps_avx512vl(auVar158,auVar159,1);
            auVar158 = vsubps_avx512vl(auVar159,auVar172);
            bVar14 = (bool)((byte)uVar16 & 1);
            auVar167._0_4_ = (uint)bVar14 * auVar158._0_4_ | (uint)!bVar14 * auVar159._0_4_;
            bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
            auVar167._4_4_ = (uint)bVar14 * auVar158._4_4_ | (uint)!bVar14 * auVar159._4_4_;
            bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
            auVar167._8_4_ = (uint)bVar14 * auVar158._8_4_ | (uint)!bVar14 * auVar159._8_4_;
            bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
            auVar167._12_4_ = (uint)bVar14 * auVar158._12_4_ | (uint)!bVar14 * auVar159._12_4_;
            bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
            auVar167._16_4_ = (uint)bVar14 * auVar158._16_4_ | (uint)!bVar14 * auVar159._16_4_;
            bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
            auVar167._20_4_ = (uint)bVar14 * auVar158._20_4_ | (uint)!bVar14 * auVar159._20_4_;
            bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
            auVar167._24_4_ = (uint)bVar14 * auVar158._24_4_ | (uint)!bVar14 * auVar159._24_4_;
            bVar14 = SUB81(uVar16 >> 7,0);
            auVar167._28_4_ = (uint)bVar14 * auVar158._28_4_ | (uint)!bVar14 * auVar159._28_4_;
            in_ZMM17 = ZEXT3264(auVar167);
            auVar157 = vfmsub231ps_avx512vl(auVar157,auVar167,auVar173);
            auVar157 = vfnmsub231ps_avx512vl(auVar157,auVar167,auVar179);
            auVar158 = vmulps_avx512vl(auVar157,auVar157);
            auVar159 = vfmadd213ps_avx512vl(auVar174,auVar157,auVar175);
            auVar159 = vfmadd213ps_avx512vl(auVar159,auVar157,auVar180);
            auVar159 = vfmadd213ps_avx512vl(auVar159,auVar157,auVar176);
            auVar159 = vfmadd213ps_avx512vl(auVar159,auVar157,auVar177);
            auVar159 = vfmadd213ps_avx512vl(auVar159,auVar157,auVar170);
            auVar157 = vfmadd213ps_avx512vl(auVar159,auVar158,auVar157);
            in_ZMM18 = ZEXT3264(auVar157);
            auVar157 = vaddps_avx512vl(auVar157,auVar172);
            auVar158 = vcvttps2dq_avx512vl(auVar167);
            auVar158 = vpslld_avx512vl(auVar158,0x17);
            in_ZMM16 = ZEXT3264(auVar158);
            auVar158 = vpaddd_avx512vl(auVar158,auVar178);
            auVar123 = vfmadd213ps_fma(auVar158,auVar157,auVar172);
            auVar157 = vrcpps_avx(ZEXT1632(auVar123));
            auVar123 = vfmsub213ps_fma(ZEXT1632(auVar123),auVar157,auVar172);
            auVar123 = vfnmadd132ps_fma(ZEXT1632(auVar123),auVar157,auVar157);
            auVar157 = vfnmadd213ps_avx512vl(ZEXT1632(auVar123),auVar155,auVar151);
            auVar149 = auVar157._0_28_;
            goto LAB_002b6236;
          case 6:
            uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
            auVar159._4_4_ = uVar7;
            auVar159._0_4_ = uVar7;
            auVar159._8_4_ = uVar7;
            auVar159._12_4_ = uVar7;
            auVar159._16_4_ = uVar7;
            auVar159._20_4_ = uVar7;
            auVar159._24_4_ = uVar7;
            auVar159._28_4_ = uVar7;
            uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var9))[1];
            auVar158._4_4_ = uVar7;
            auVar158._0_4_ = uVar7;
            auVar158._8_4_ = uVar7;
            auVar158._12_4_ = uVar7;
            auVar158._16_4_ = uVar7;
            auVar158._20_4_ = uVar7;
            auVar158._24_4_ = uVar7;
            auVar158._28_4_ = uVar7;
            auVar158 = vfmadd213ps_avx512vl(auVar159,auVar156,auVar158);
            auVar157 = vmaxps_avx(auVar158,auVar157);
            auVar157 = vminps_avx(auVar157,auVar172);
            auVar149 = auVar157._0_28_;
LAB_002b6236:
            auVar156._4_4_ = auVar149._4_4_ * auVar156._4_4_;
            auVar156._0_4_ = auVar149._0_4_ * auVar156._0_4_;
            auVar156._8_4_ = auVar149._8_4_ * auVar156._8_4_;
            auVar156._12_4_ = auVar149._12_4_ * auVar156._12_4_;
            auVar156._16_4_ = auVar149._16_4_ * auVar156._16_4_;
            auVar156._20_4_ = auVar149._20_4_ * auVar156._20_4_;
            auVar156._24_4_ = auVar149._24_4_ * auVar156._24_4_;
          }
LAB_002b623a:
          *(undefined1 (*) [32])((long)top_blob->data + uVar102 * 0x20) = auVar156;
          uVar102 = uVar102 + 1;
        } while (uVar102 != uVar103);
      }
      goto LAB_002b6258;
    }
    if ((iVar100 == 0x10) && (0 < (int)uVar114)) {
      auVar188 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar189 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q2,auVar188);
      auVar190 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar188);
      auVar191 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      auVar192 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar188);
      uVar102 = 0;
      auVar123 = vxorps_avx512vl(auVar123,auVar123);
      auVar272 = ZEXT1664(auVar123);
      auVar193 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar194 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      do {
        auVar123 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        auVar267 = ZEXT1664(auVar123);
        if (lVar11 != 0) {
          auVar267 = *(undefined1 (*) [64])(lVar11 + uVar102 * 0x40);
        }
        pauVar109 = (undefined1 (*) [64])
                    ((long)(this->weight_data_tm).w * uVar102 * (this->weight_data_tm).elemsize +
                    (long)(this->weight_data_tm).data);
        auVar125 = in_ZMM18._0_16_;
        auVar129 = in_ZMM23._0_16_;
        auVar127 = in_ZMM21._0_16_;
        auVar128 = in_ZMM22._0_16_;
        auVar124 = in_ZMM19._0_16_;
        auVar126 = in_ZMM20._0_16_;
        auVar123 = in_ZMM17._0_16_;
        pauVar111 = local_128;
        if ((int)uVar121 < 8) {
          auVar125 = vxorps_avx512vl(auVar125,auVar125);
          auVar269 = ZEXT1664(auVar125);
          auVar125 = vxorps_avx512vl(auVar129,auVar129);
          in_ZMM23 = ZEXT1664(auVar125);
          auVar125 = vxorps_avx512vl(auVar127,auVar127);
          auVar271 = ZEXT1664(auVar125);
          auVar125 = vxorps_avx512vl(auVar128,auVar128);
          in_ZMM22 = ZEXT1664(auVar125);
          auVar125 = vxorps_avx512vl(auVar124,auVar124);
          auVar270 = ZEXT1664(auVar125);
          auVar125 = vxorps_avx512vl(auVar126,auVar126);
          in_ZMM20 = ZEXT1664(auVar125);
          auVar123 = vxorps_avx512vl(auVar123,auVar123);
          auVar268 = ZEXT1664(auVar123);
          uVar114 = 0;
        }
        else {
          auVar123 = vxorps_avx512vl(auVar123,auVar123);
          auVar268 = ZEXT1664(auVar123);
          iVar100 = 7;
          auVar123 = vxorps_avx512vl(auVar126,auVar126);
          in_ZMM20 = ZEXT1664(auVar123);
          auVar123 = vxorps_avx512vl(auVar124,auVar124);
          auVar270 = ZEXT1664(auVar123);
          auVar123 = vxorps_avx512vl(auVar128,auVar128);
          in_ZMM22 = ZEXT1664(auVar123);
          auVar123 = vxorps_avx512vl(auVar127,auVar127);
          auVar271 = ZEXT1664(auVar123);
          auVar123 = vxorps_avx512vl(auVar129,auVar129);
          in_ZMM23 = ZEXT1664(auVar123);
          auVar123 = vxorps_avx512vl(auVar125,auVar125);
          auVar269 = ZEXT1664(auVar123);
          do {
            auVar195 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar111));
            auVar196 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar111 + 4)));
            auVar197 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar111 + 8)));
            auVar198 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar111 + 0xc)));
            auVar267 = vfmadd231ps_avx512f(auVar267,auVar195,*pauVar109);
            auVar268 = vfmadd231ps_avx512f(auVar268,auVar196,pauVar109[1]);
            in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar197,pauVar109[2]);
            auVar270 = vfmadd231ps_avx512f(auVar270,auVar198,pauVar109[3]);
            auVar195 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar111 + 0x10)));
            auVar196 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar111 + 0x14)));
            auVar197 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar111 + 0x18)));
            auVar198 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar111 + 0x1c)));
            in_ZMM22 = vfmadd231ps_avx512f(in_ZMM22,auVar195,pauVar109[4]);
            auVar271 = vfmadd231ps_avx512f(auVar271,auVar196,pauVar109[5]);
            in_ZMM23 = vfmadd231ps_avx512f(in_ZMM23,auVar197,pauVar109[6]);
            auVar269 = vfmadd231ps_avx512f(auVar269,auVar198,pauVar109[7]);
            pauVar111 = pauVar111 + 1;
            pauVar109 = pauVar109 + 8;
            iVar100 = iVar100 + 8;
            uVar114 = uVar121 & 0xfffffff8;
          } while (iVar100 < (int)uVar121);
        }
        uVar117 = uVar114 | 3;
        while ((int)uVar117 < (int)uVar121) {
          auVar195 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar111));
          auVar196 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar111 + 4)));
          auVar197 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar111 + 8)));
          auVar198 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar111 + 0xc)));
          auVar267 = vfmadd231ps_avx512f(auVar267,auVar195,*pauVar109);
          auVar268 = vfmadd231ps_avx512f(auVar268,auVar196,pauVar109[1]);
          in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar197,pauVar109[2]);
          auVar270 = vfmadd231ps_avx512f(auVar270,auVar198,pauVar109[3]);
          pauVar111 = (undefined1 (*) [32])(*pauVar111 + 0x10);
          pauVar109 = pauVar109 + 4;
          uVar117 = uVar114 + 7;
          uVar114 = uVar114 + 4;
        }
        if (uVar121 - uVar114 != 0 && (int)uVar114 <= (int)uVar121) {
          lVar115 = 0;
          do {
            auVar195 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar111 + lVar115 * 4)));
            auVar267 = vfmadd231ps_avx512f(auVar267,auVar195,*pauVar109);
            pauVar109 = pauVar109 + 1;
            lVar115 = lVar115 + 1;
          } while (uVar121 - uVar114 != (int)lVar115);
        }
        auVar269 = vaddps_avx512f(in_ZMM23,auVar269);
        in_ZMM21 = vaddps_avx512f(auVar271,in_ZMM22);
        in_ZMM18 = vaddps_avx512f(auVar269,in_ZMM21);
        in_ZMM19 = vaddps_avx512f(auVar270,in_ZMM20);
        auVar268 = vaddps_avx512f(in_ZMM19,auVar268);
        in_ZMM17 = vaddps_avx512f(in_ZMM18,auVar268);
        auVar267 = vaddps_avx512f(in_ZMM17,auVar267);
        in_ZMM16 = auVar267;
        switch(uVar101) {
        case 1:
          in_ZMM16 = vmaxps_avx512f(auVar267,auVar272);
          break;
        case 2:
          uVar16 = vcmpps_avx512f(auVar267,auVar272,1);
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
          auVar197._4_4_ = uVar7;
          auVar197._0_4_ = uVar7;
          auVar197._8_4_ = uVar7;
          auVar197._12_4_ = uVar7;
          auVar197._16_4_ = uVar7;
          auVar197._20_4_ = uVar7;
          auVar197._24_4_ = uVar7;
          auVar197._28_4_ = uVar7;
          auVar197._32_4_ = uVar7;
          auVar197._36_4_ = uVar7;
          auVar197._40_4_ = uVar7;
          auVar197._44_4_ = uVar7;
          auVar197._48_4_ = uVar7;
          auVar197._52_4_ = uVar7;
          auVar197._56_4_ = uVar7;
          auVar197._60_4_ = uVar7;
          auVar268 = vmulps_avx512f(auVar267,auVar197);
          bVar14 = (bool)((byte)uVar16 & 1);
          in_ZMM16._0_4_ = (uint)bVar14 * auVar268._0_4_ | (uint)!bVar14 * auVar267._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          in_ZMM16._4_4_ = (uint)bVar14 * auVar268._4_4_ | (uint)!bVar14 * auVar267._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          in_ZMM16._8_4_ = (uint)bVar14 * auVar268._8_4_ | (uint)!bVar14 * auVar267._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          in_ZMM16._12_4_ = (uint)bVar14 * auVar268._12_4_ | (uint)!bVar14 * auVar267._12_4_;
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          in_ZMM16._16_4_ = (uint)bVar14 * auVar268._16_4_ | (uint)!bVar14 * auVar267._16_4_;
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          in_ZMM16._20_4_ = (uint)bVar14 * auVar268._20_4_ | (uint)!bVar14 * auVar267._20_4_;
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          in_ZMM16._24_4_ = (uint)bVar14 * auVar268._24_4_ | (uint)!bVar14 * auVar267._24_4_;
          bVar14 = (bool)((byte)(uVar16 >> 7) & 1);
          in_ZMM16._28_4_ = (uint)bVar14 * auVar268._28_4_ | (uint)!bVar14 * auVar267._28_4_;
          bVar14 = (bool)((byte)(uVar16 >> 8) & 1);
          in_ZMM16._32_4_ = (uint)bVar14 * auVar268._32_4_ | (uint)!bVar14 * auVar267._32_4_;
          bVar14 = (bool)((byte)(uVar16 >> 9) & 1);
          in_ZMM16._36_4_ = (uint)bVar14 * auVar268._36_4_ | (uint)!bVar14 * auVar267._36_4_;
          bVar14 = (bool)((byte)(uVar16 >> 10) & 1);
          in_ZMM16._40_4_ = (uint)bVar14 * auVar268._40_4_ | (uint)!bVar14 * auVar267._40_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xb) & 1);
          in_ZMM16._44_4_ = (uint)bVar14 * auVar268._44_4_ | (uint)!bVar14 * auVar267._44_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xc) & 1);
          in_ZMM16._48_4_ = (uint)bVar14 * auVar268._48_4_ | (uint)!bVar14 * auVar267._48_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xd) & 1);
          in_ZMM16._52_4_ = (uint)bVar14 * auVar268._52_4_ | (uint)!bVar14 * auVar267._52_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xe) & 1);
          in_ZMM16._56_4_ = (uint)bVar14 * auVar268._56_4_ | (uint)!bVar14 * auVar267._56_4_;
          bVar14 = SUB81(uVar16 >> 0xf,0);
          in_ZMM16._60_4_ = (uint)bVar14 * auVar268._60_4_ | (uint)!bVar14 * auVar267._60_4_;
          break;
        case 3:
          uVar7 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var9);
          auVar196._4_4_ = uVar7;
          auVar196._0_4_ = uVar7;
          auVar196._8_4_ = uVar7;
          auVar196._12_4_ = uVar7;
          auVar196._16_4_ = uVar7;
          auVar196._20_4_ = uVar7;
          auVar196._24_4_ = uVar7;
          auVar196._28_4_ = uVar7;
          auVar196._32_4_ = uVar7;
          auVar196._36_4_ = uVar7;
          auVar196._40_4_ = uVar7;
          auVar196._44_4_ = uVar7;
          auVar196._48_4_ = uVar7;
          auVar196._52_4_ = uVar7;
          auVar196._56_4_ = uVar7;
          auVar196._60_4_ = uVar7;
          auVar268 = vmaxps_avx512f(auVar267,auVar196);
          uVar7 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var9))[1];
          auVar267._4_4_ = uVar7;
          auVar267._0_4_ = uVar7;
          auVar267._8_4_ = uVar7;
          auVar267._12_4_ = uVar7;
          auVar267._16_4_ = uVar7;
          auVar267._20_4_ = uVar7;
          auVar267._24_4_ = uVar7;
          auVar267._28_4_ = uVar7;
          auVar267._32_4_ = uVar7;
          auVar267._36_4_ = uVar7;
          auVar267._40_4_ = uVar7;
          auVar267._44_4_ = uVar7;
          auVar267._48_4_ = uVar7;
          auVar267._52_4_ = uVar7;
          auVar267._56_4_ = uVar7;
          auVar267._60_4_ = uVar7;
          in_ZMM16 = vminps_avx512f(auVar268,auVar267);
          break;
        case 4:
          auVar267 = vxorps_avx512dq(auVar267,auVar188);
          auVar267 = vminps_avx512f(auVar267,(undefined1  [64])afVar89);
          auVar267 = vmaxps_avx512f(auVar267,(undefined1  [64])afVar90);
          auVar268 = vfmadd213ps_avx512f((undefined1  [64])afVar91,auVar267,
                                         (undefined1  [64])afVar97);
          auVar270 = vrndscaleps_avx512f(auVar268,1);
          uVar16 = vcmpps_avx512f(auVar268,auVar270,1);
          auVar268 = vsubps_avx512f(auVar270,(undefined1  [64])afVar88);
          bVar14 = (bool)((byte)uVar16 & 1);
          in_ZMM18._0_4_ = (uint)bVar14 * auVar268._0_4_ | (uint)!bVar14 * auVar270._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          in_ZMM18._4_4_ = (uint)bVar14 * auVar268._4_4_ | (uint)!bVar14 * auVar270._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          in_ZMM18._8_4_ = (uint)bVar14 * auVar268._8_4_ | (uint)!bVar14 * auVar270._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          in_ZMM18._12_4_ = (uint)bVar14 * auVar268._12_4_ | (uint)!bVar14 * auVar270._12_4_;
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          in_ZMM18._16_4_ = (uint)bVar14 * auVar268._16_4_ | (uint)!bVar14 * auVar270._16_4_;
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          in_ZMM18._20_4_ = (uint)bVar14 * auVar268._20_4_ | (uint)!bVar14 * auVar270._20_4_;
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          in_ZMM18._24_4_ = (uint)bVar14 * auVar268._24_4_ | (uint)!bVar14 * auVar270._24_4_;
          bVar14 = (bool)((byte)(uVar16 >> 7) & 1);
          in_ZMM18._28_4_ = (uint)bVar14 * auVar268._28_4_ | (uint)!bVar14 * auVar270._28_4_;
          bVar14 = (bool)((byte)(uVar16 >> 8) & 1);
          in_ZMM18._32_4_ = (uint)bVar14 * auVar268._32_4_ | (uint)!bVar14 * auVar270._32_4_;
          bVar14 = (bool)((byte)(uVar16 >> 9) & 1);
          in_ZMM18._36_4_ = (uint)bVar14 * auVar268._36_4_ | (uint)!bVar14 * auVar270._36_4_;
          bVar14 = (bool)((byte)(uVar16 >> 10) & 1);
          in_ZMM18._40_4_ = (uint)bVar14 * auVar268._40_4_ | (uint)!bVar14 * auVar270._40_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xb) & 1);
          in_ZMM18._44_4_ = (uint)bVar14 * auVar268._44_4_ | (uint)!bVar14 * auVar270._44_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xc) & 1);
          in_ZMM18._48_4_ = (uint)bVar14 * auVar268._48_4_ | (uint)!bVar14 * auVar270._48_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xd) & 1);
          in_ZMM18._52_4_ = (uint)bVar14 * auVar268._52_4_ | (uint)!bVar14 * auVar270._52_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xe) & 1);
          in_ZMM18._56_4_ = (uint)bVar14 * auVar268._56_4_ | (uint)!bVar14 * auVar270._56_4_;
          bVar14 = SUB81(uVar16 >> 0xf,0);
          in_ZMM18._60_4_ = (uint)bVar14 * auVar268._60_4_ | (uint)!bVar14 * auVar270._60_4_;
          auVar267 = vfmadd231ps_avx512f(auVar267,in_ZMM18,auVar189);
          auVar267 = vfmadd231ps_avx512f(auVar267,in_ZMM18,auVar190);
          auVar268 = vmulps_avx512f(auVar267,auVar267);
          auVar270 = vfmadd213ps_avx512f(auVar267,(undefined1  [64])afVar92,
                                         (undefined1  [64])afVar93);
          auVar270 = vfmadd213ps_avx512f(auVar270,auVar267,(undefined1  [64])afVar94);
          auVar270 = vfmadd213ps_avx512f(auVar270,auVar267,(undefined1  [64])afVar95);
          auVar270 = vfmadd213ps_avx512f(auVar270,auVar267,(undefined1  [64])afVar96);
          auVar270 = vfmadd213ps_avx512f(auVar270,auVar267,(undefined1  [64])afVar97);
          in_ZMM19 = vfmadd213ps_avx512f(auVar270,auVar268,auVar267);
          auVar267 = vaddps_avx512f(in_ZMM19,(undefined1  [64])afVar88);
          auVar268 = vcvttps2dq_avx512f(in_ZMM18);
          auVar268 = vpaddd_avx512f(auVar268,auVar191);
          auVar268 = vpslld_avx512f(auVar268,0x17);
          auVar267 = vfmadd213ps_avx512f(auVar268,auVar267,auVar193);
          in_ZMM17 = vrcp14ps_avx512f(auVar267);
          auVar267 = vfmsub213ps_avx512f(auVar267,in_ZMM17,auVar193);
          in_ZMM16 = vfnmadd132ps_avx512vl(auVar267,in_ZMM17,in_ZMM17);
          break;
        case 5:
          auVar268 = vminps_avx512f(auVar267,(undefined1  [64])afVar89);
          auVar268 = vmaxps_avx512f(auVar268,(undefined1  [64])afVar90);
          auVar270 = vfmadd213ps_avx512f((undefined1  [64])afVar91,auVar268,
                                         (undefined1  [64])afVar97);
          auVar271 = vrndscaleps_avx512f(auVar270,1);
          uVar16 = vcmpps_avx512f(auVar270,auVar271,1);
          auVar270 = vsubps_avx512f(auVar271,(undefined1  [64])afVar88);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar269._0_4_ = (uint)bVar14 * auVar270._0_4_ | (uint)!bVar14 * auVar271._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar269._4_4_ = (uint)bVar14 * auVar270._4_4_ | (uint)!bVar14 * auVar271._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar269._8_4_ = (uint)bVar14 * auVar270._8_4_ | (uint)!bVar14 * auVar271._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar269._12_4_ = (uint)bVar14 * auVar270._12_4_ | (uint)!bVar14 * auVar271._12_4_;
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar269._16_4_ = (uint)bVar14 * auVar270._16_4_ | (uint)!bVar14 * auVar271._16_4_;
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar269._20_4_ = (uint)bVar14 * auVar270._20_4_ | (uint)!bVar14 * auVar271._20_4_;
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar269._24_4_ = (uint)bVar14 * auVar270._24_4_ | (uint)!bVar14 * auVar271._24_4_;
          bVar14 = (bool)((byte)(uVar16 >> 7) & 1);
          auVar269._28_4_ = (uint)bVar14 * auVar270._28_4_ | (uint)!bVar14 * auVar271._28_4_;
          bVar14 = (bool)((byte)(uVar16 >> 8) & 1);
          auVar269._32_4_ = (uint)bVar14 * auVar270._32_4_ | (uint)!bVar14 * auVar271._32_4_;
          bVar14 = (bool)((byte)(uVar16 >> 9) & 1);
          auVar269._36_4_ = (uint)bVar14 * auVar270._36_4_ | (uint)!bVar14 * auVar271._36_4_;
          bVar14 = (bool)((byte)(uVar16 >> 10) & 1);
          auVar269._40_4_ = (uint)bVar14 * auVar270._40_4_ | (uint)!bVar14 * auVar271._40_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xb) & 1);
          auVar269._44_4_ = (uint)bVar14 * auVar270._44_4_ | (uint)!bVar14 * auVar271._44_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xc) & 1);
          auVar269._48_4_ = (uint)bVar14 * auVar270._48_4_ | (uint)!bVar14 * auVar271._48_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xd) & 1);
          auVar269._52_4_ = (uint)bVar14 * auVar270._52_4_ | (uint)!bVar14 * auVar271._52_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xe) & 1);
          auVar269._56_4_ = (uint)bVar14 * auVar270._56_4_ | (uint)!bVar14 * auVar271._56_4_;
          bVar14 = SUB81(uVar16 >> 0xf,0);
          auVar269._60_4_ = (uint)bVar14 * auVar270._60_4_ | (uint)!bVar14 * auVar271._60_4_;
          auVar268 = vfmadd231ps_avx512f(auVar268,auVar269,auVar189);
          auVar268 = vfmadd231ps_avx512f(auVar268,auVar269,auVar190);
          auVar270 = vmulps_avx512f(auVar268,auVar268);
          auVar271 = vfmadd213ps_avx512f(auVar268,(undefined1  [64])afVar92,
                                         (undefined1  [64])afVar93);
          auVar271 = vfmadd213ps_avx512f(auVar271,auVar268,(undefined1  [64])afVar94);
          auVar271 = vfmadd213ps_avx512f(auVar271,auVar268,(undefined1  [64])afVar95);
          auVar271 = vfmadd213ps_avx512f(auVar271,auVar268,(undefined1  [64])afVar96);
          auVar271 = vfmadd213ps_avx512f(auVar271,auVar268,(undefined1  [64])afVar97);
          auVar268 = vfmadd213ps_avx512f(auVar271,auVar270,auVar268);
          auVar268 = vaddps_avx512f(auVar268,(undefined1  [64])afVar88);
          auVar270 = vcvttps2dq_avx512f(auVar269);
          auVar270 = vpaddd_avx512f(auVar270,auVar191);
          auVar270 = vpslld_avx512f(auVar270,0x17);
          auVar268 = vfmadd213ps_avx512f(auVar270,auVar268,auVar193);
          auVar270 = vmaxps_avx512f(auVar268,(undefined1  [64])_ps512_min_norm_pos);
          auVar271 = vpsrld_avx512f(auVar270,0x17);
          auVar270 = vpternlogd_avx512f(auVar270,(undefined1  [64])afVar97,
                                        (undefined1  [64])_ps512_inv_mant_mask,0xec);
          uVar16 = vcmpps_avx512f(auVar270,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar269 = vsubps_avx512f(auVar270,(undefined1  [64])afVar88);
          auVar195 = vaddps_avx512f(auVar269,auVar270);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar270._0_4_ = (uint)bVar14 * auVar195._0_4_ | (uint)!bVar14 * auVar269._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar270._4_4_ = (uint)bVar14 * auVar195._4_4_ | (uint)!bVar14 * auVar269._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar270._8_4_ = (uint)bVar14 * auVar195._8_4_ | (uint)!bVar14 * auVar269._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar270._12_4_ = (uint)bVar14 * auVar195._12_4_ | (uint)!bVar14 * auVar269._12_4_;
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar270._16_4_ = (uint)bVar14 * auVar195._16_4_ | (uint)!bVar14 * auVar269._16_4_;
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar270._20_4_ = (uint)bVar14 * auVar195._20_4_ | (uint)!bVar14 * auVar269._20_4_;
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar270._24_4_ = (uint)bVar14 * auVar195._24_4_ | (uint)!bVar14 * auVar269._24_4_;
          bVar14 = (bool)((byte)(uVar16 >> 7) & 1);
          auVar270._28_4_ = (uint)bVar14 * auVar195._28_4_ | (uint)!bVar14 * auVar269._28_4_;
          bVar15 = (byte)(uVar16 >> 8);
          bVar14 = (bool)(bVar15 & 1);
          auVar270._32_4_ = (uint)bVar14 * auVar195._32_4_ | (uint)!bVar14 * auVar269._32_4_;
          bVar14 = (bool)((byte)(uVar16 >> 9) & 1);
          auVar270._36_4_ = (uint)bVar14 * auVar195._36_4_ | (uint)!bVar14 * auVar269._36_4_;
          bVar14 = (bool)((byte)(uVar16 >> 10) & 1);
          auVar270._40_4_ = (uint)bVar14 * auVar195._40_4_ | (uint)!bVar14 * auVar269._40_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xb) & 1);
          auVar270._44_4_ = (uint)bVar14 * auVar195._44_4_ | (uint)!bVar14 * auVar269._44_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xc) & 1);
          auVar270._48_4_ = (uint)bVar14 * auVar195._48_4_ | (uint)!bVar14 * auVar269._48_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xd) & 1);
          auVar270._52_4_ = (uint)bVar14 * auVar195._52_4_ | (uint)!bVar14 * auVar269._52_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xe) & 1);
          auVar270._56_4_ = (uint)bVar14 * auVar195._56_4_ | (uint)!bVar14 * auVar269._56_4_;
          bVar14 = SUB81(uVar16 >> 0xf,0);
          auVar270._60_4_ = (uint)bVar14 * auVar195._60_4_ | (uint)!bVar14 * auVar269._60_4_;
          auVar269 = vmulps_avx512f(auVar270,auVar270);
          auVar195 = vfmadd132ps_avx512f(auVar270,(undefined1  [64])_ps512_cephes_log_p1,
                                         (undefined1  [64])_ps512_cephes_log_p0);
          auVar195 = vfmadd213ps_avx512f(auVar195,auVar270,(undefined1  [64])_ps512_cephes_log_p2);
          auVar195 = vfmadd213ps_avx512f(auVar195,auVar270,(undefined1  [64])_ps512_cephes_log_p3);
          auVar195 = vfmadd213ps_avx512f(auVar195,auVar270,(undefined1  [64])_ps512_cephes_log_p4);
          auVar195 = vfmadd213ps_avx512f(auVar195,auVar270,(undefined1  [64])_ps512_cephes_log_p5);
          auVar195 = vfmadd213ps_avx512f(auVar195,auVar270,(undefined1  [64])_ps512_cephes_log_p6);
          auVar195 = vfmadd213ps_avx512f(auVar195,auVar270,(undefined1  [64])_ps512_cephes_log_p7);
          in_ZMM21 = vfmadd213ps_avx512f(auVar195,auVar270,(undefined1  [64])_ps512_cephes_log_p8);
          auVar195 = vmulps_avx512f(auVar269,auVar270);
          auVar270 = vfmadd213ps_avx512f(auVar195,in_ZMM21,auVar270);
          uVar17 = vcmpps_avx512f(auVar268,auVar272,2);
          auVar268 = vpsubd_avx512f(auVar271,auVar191);
          auVar268 = vcvtdq2ps_avx512f(auVar268);
          auVar271 = vaddps_avx512f(auVar268,(undefined1  [64])afVar88);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar195._0_4_ = (uint)bVar14 * auVar268._0_4_ | (uint)!bVar14 * auVar271._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar195._4_4_ = (uint)bVar14 * auVar268._4_4_ | (uint)!bVar14 * auVar271._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar195._8_4_ = (uint)bVar14 * auVar268._8_4_ | (uint)!bVar14 * auVar271._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar195._12_4_ = (uint)bVar14 * auVar268._12_4_ | (uint)!bVar14 * auVar271._12_4_;
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar195._16_4_ = (uint)bVar14 * auVar268._16_4_ | (uint)!bVar14 * auVar271._16_4_;
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar195._20_4_ = (uint)bVar14 * auVar268._20_4_ | (uint)!bVar14 * auVar271._20_4_;
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar195._24_4_ = (uint)bVar14 * auVar268._24_4_ | (uint)!bVar14 * auVar271._24_4_;
          bVar14 = (bool)((byte)(uVar16 >> 7) & 1);
          auVar195._28_4_ = (uint)bVar14 * auVar268._28_4_ | (uint)!bVar14 * auVar271._28_4_;
          bVar14 = (bool)(bVar15 & 1);
          auVar195._32_4_ = (uint)bVar14 * auVar268._32_4_ | (uint)!bVar14 * auVar271._32_4_;
          bVar14 = (bool)((byte)(uVar16 >> 9) & 1);
          auVar195._36_4_ = (uint)bVar14 * auVar268._36_4_ | (uint)!bVar14 * auVar271._36_4_;
          bVar14 = (bool)((byte)(uVar16 >> 10) & 1);
          auVar195._40_4_ = (uint)bVar14 * auVar268._40_4_ | (uint)!bVar14 * auVar271._40_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xb) & 1);
          auVar195._44_4_ = (uint)bVar14 * auVar268._44_4_ | (uint)!bVar14 * auVar271._44_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xc) & 1);
          auVar195._48_4_ = (uint)bVar14 * auVar268._48_4_ | (uint)!bVar14 * auVar271._48_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xd) & 1);
          auVar195._52_4_ = (uint)bVar14 * auVar268._52_4_ | (uint)!bVar14 * auVar271._52_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xe) & 1);
          auVar195._56_4_ = (uint)bVar14 * auVar268._56_4_ | (uint)!bVar14 * auVar271._56_4_;
          bVar14 = SUB81(uVar16 >> 0xf,0);
          auVar195._60_4_ = (uint)bVar14 * auVar268._60_4_ | (uint)!bVar14 * auVar271._60_4_;
          auVar268 = vfmadd231ps_avx512f(auVar270,auVar195,(undefined1  [64])afVar98);
          auVar268 = vfmadd231ps_avx512f(auVar268,auVar192,auVar269);
          in_ZMM22 = vfmadd231ps_avx512f(auVar268,(undefined1  [64])afVar99,auVar195);
          auVar268 = vmulps_avx512f(in_ZMM22,auVar194);
          auVar270 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          bVar14 = (bool)((byte)uVar17 & 1);
          auVar271._0_4_ = (uint)bVar14 * auVar270._0_4_ | (uint)!bVar14 * auVar268._0_4_;
          bVar14 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar271._4_4_ = (uint)bVar14 * auVar270._4_4_ | (uint)!bVar14 * auVar268._4_4_;
          bVar14 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar271._8_4_ = (uint)bVar14 * auVar270._8_4_ | (uint)!bVar14 * auVar268._8_4_;
          bVar14 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar271._12_4_ = (uint)bVar14 * auVar270._12_4_ | (uint)!bVar14 * auVar268._12_4_;
          bVar14 = (bool)((byte)(uVar17 >> 4) & 1);
          auVar271._16_4_ = (uint)bVar14 * auVar270._16_4_ | (uint)!bVar14 * auVar268._16_4_;
          bVar14 = (bool)((byte)(uVar17 >> 5) & 1);
          auVar271._20_4_ = (uint)bVar14 * auVar270._20_4_ | (uint)!bVar14 * auVar268._20_4_;
          bVar14 = (bool)((byte)(uVar17 >> 6) & 1);
          auVar271._24_4_ = (uint)bVar14 * auVar270._24_4_ | (uint)!bVar14 * auVar268._24_4_;
          bVar14 = (bool)((byte)(uVar17 >> 7) & 1);
          auVar271._28_4_ = (uint)bVar14 * auVar270._28_4_ | (uint)!bVar14 * auVar268._28_4_;
          bVar14 = (bool)((byte)(uVar17 >> 8) & 1);
          auVar271._32_4_ = (uint)bVar14 * auVar270._32_4_ | (uint)!bVar14 * auVar268._32_4_;
          bVar14 = (bool)((byte)(uVar17 >> 9) & 1);
          auVar271._36_4_ = (uint)bVar14 * auVar270._36_4_ | (uint)!bVar14 * auVar268._36_4_;
          bVar14 = (bool)((byte)(uVar17 >> 10) & 1);
          auVar271._40_4_ = (uint)bVar14 * auVar270._40_4_ | (uint)!bVar14 * auVar268._40_4_;
          bVar14 = (bool)((byte)(uVar17 >> 0xb) & 1);
          auVar271._44_4_ = (uint)bVar14 * auVar270._44_4_ | (uint)!bVar14 * auVar268._44_4_;
          bVar14 = (bool)((byte)(uVar17 >> 0xc) & 1);
          auVar271._48_4_ = (uint)bVar14 * auVar270._48_4_ | (uint)!bVar14 * auVar268._48_4_;
          bVar14 = (bool)((byte)(uVar17 >> 0xd) & 1);
          auVar271._52_4_ = (uint)bVar14 * auVar270._52_4_ | (uint)!bVar14 * auVar268._52_4_;
          bVar14 = (bool)((byte)(uVar17 >> 0xe) & 1);
          auVar271._56_4_ = (uint)bVar14 * auVar270._56_4_ | (uint)!bVar14 * auVar268._56_4_;
          bVar14 = SUB81(uVar17 >> 0xf,0);
          auVar271._60_4_ = (uint)bVar14 * auVar270._60_4_ | (uint)!bVar14 * auVar268._60_4_;
          auVar268 = vminps_avx512f(auVar271,(undefined1  [64])afVar89);
          auVar268 = vmaxps_avx512f(auVar268,(undefined1  [64])afVar90);
          auVar270 = vfmadd213ps_avx512f((undefined1  [64])afVar91,auVar268,
                                         (undefined1  [64])afVar97);
          auVar271 = vrndscaleps_avx512f(auVar270,1);
          uVar16 = vcmpps_avx512f(auVar270,auVar271,1);
          auVar270 = vsubps_avx512f(auVar271,(undefined1  [64])afVar88);
          bVar14 = (bool)((byte)uVar16 & 1);
          in_ZMM19._0_4_ = (uint)bVar14 * auVar270._0_4_ | (uint)!bVar14 * auVar271._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          in_ZMM19._4_4_ = (uint)bVar14 * auVar270._4_4_ | (uint)!bVar14 * auVar271._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          in_ZMM19._8_4_ = (uint)bVar14 * auVar270._8_4_ | (uint)!bVar14 * auVar271._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          in_ZMM19._12_4_ = (uint)bVar14 * auVar270._12_4_ | (uint)!bVar14 * auVar271._12_4_;
          bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
          in_ZMM19._16_4_ = (uint)bVar14 * auVar270._16_4_ | (uint)!bVar14 * auVar271._16_4_;
          bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
          in_ZMM19._20_4_ = (uint)bVar14 * auVar270._20_4_ | (uint)!bVar14 * auVar271._20_4_;
          bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
          in_ZMM19._24_4_ = (uint)bVar14 * auVar270._24_4_ | (uint)!bVar14 * auVar271._24_4_;
          bVar14 = (bool)((byte)(uVar16 >> 7) & 1);
          in_ZMM19._28_4_ = (uint)bVar14 * auVar270._28_4_ | (uint)!bVar14 * auVar271._28_4_;
          bVar14 = (bool)((byte)(uVar16 >> 8) & 1);
          in_ZMM19._32_4_ = (uint)bVar14 * auVar270._32_4_ | (uint)!bVar14 * auVar271._32_4_;
          bVar14 = (bool)((byte)(uVar16 >> 9) & 1);
          in_ZMM19._36_4_ = (uint)bVar14 * auVar270._36_4_ | (uint)!bVar14 * auVar271._36_4_;
          bVar14 = (bool)((byte)(uVar16 >> 10) & 1);
          in_ZMM19._40_4_ = (uint)bVar14 * auVar270._40_4_ | (uint)!bVar14 * auVar271._40_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xb) & 1);
          in_ZMM19._44_4_ = (uint)bVar14 * auVar270._44_4_ | (uint)!bVar14 * auVar271._44_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xc) & 1);
          in_ZMM19._48_4_ = (uint)bVar14 * auVar270._48_4_ | (uint)!bVar14 * auVar271._48_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xd) & 1);
          in_ZMM19._52_4_ = (uint)bVar14 * auVar270._52_4_ | (uint)!bVar14 * auVar271._52_4_;
          bVar14 = (bool)((byte)(uVar16 >> 0xe) & 1);
          in_ZMM19._56_4_ = (uint)bVar14 * auVar270._56_4_ | (uint)!bVar14 * auVar271._56_4_;
          bVar14 = SUB81(uVar16 >> 0xf,0);
          in_ZMM19._60_4_ = (uint)bVar14 * auVar270._60_4_ | (uint)!bVar14 * auVar271._60_4_;
          auVar268 = vfmadd231ps_avx512f(auVar268,in_ZMM19,auVar189);
          auVar268 = vfmadd231ps_avx512f(auVar268,in_ZMM19,auVar190);
          auVar270 = vmulps_avx512f(auVar268,auVar268);
          auVar271 = vfmadd213ps_avx512f(auVar268,(undefined1  [64])afVar92,
                                         (undefined1  [64])afVar93);
          auVar271 = vfmadd213ps_avx512f(auVar271,auVar268,(undefined1  [64])afVar94);
          auVar271 = vfmadd213ps_avx512f(auVar271,auVar268,(undefined1  [64])afVar95);
          auVar271 = vfmadd213ps_avx512f(auVar271,auVar268,(undefined1  [64])afVar96);
          auVar271 = vfmadd213ps_avx512f(auVar271,auVar268,(undefined1  [64])afVar97);
          in_ZMM20 = vfmadd213ps_avx512f(auVar271,auVar270,auVar268);
          auVar268 = vaddps_avx512f(in_ZMM20,(undefined1  [64])afVar88);
          auVar270 = vcvttps2dq_avx512f(in_ZMM19);
          auVar270 = vpaddd_avx512f(auVar270,auVar191);
          auVar270 = vpslld_avx512f(auVar270,0x17);
          auVar268 = vfmadd213ps_avx512f(auVar270,auVar268,auVar193);
          in_ZMM17 = vrcp14ps_avx512f(auVar268);
          auVar268 = vfmsub213ps_avx512f(auVar268,in_ZMM17,auVar193);
          auVar268 = vfnmadd132ps_avx512vl(auVar268,in_ZMM17,in_ZMM17);
          in_ZMM18 = vfnmsub213ps_avx512f(auVar268,auVar194,auVar193);
          in_ZMM16 = vmulps_avx512f(in_ZMM18,auVar267);
          break;
        case 6:
          auVar270 = vbroadcastss_avx512f(ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var9)));
          uVar114 = (*(uint **)(&this->field_0xe8 + (long)p_Var9))[1];
          auVar268._4_4_ = uVar114;
          auVar268._0_4_ = uVar114;
          auVar268._8_4_ = uVar114;
          auVar268._12_4_ = uVar114;
          auVar268._16_4_ = uVar114;
          auVar268._20_4_ = uVar114;
          auVar268._24_4_ = uVar114;
          auVar268._28_4_ = uVar114;
          auVar268._32_4_ = uVar114;
          auVar268._36_4_ = uVar114;
          auVar268._40_4_ = uVar114;
          auVar268._44_4_ = uVar114;
          auVar268._48_4_ = uVar114;
          auVar268._52_4_ = uVar114;
          auVar268._56_4_ = uVar114;
          auVar268._60_4_ = uVar114;
          auVar268 = vfmadd213ps_avx512f(auVar270,auVar267,auVar268);
          auVar268 = vmaxps_avx512f(auVar268,auVar272);
          in_ZMM17 = vminps_avx512f(auVar268,auVar193);
          in_ZMM16 = vmulps_avx512f(in_ZMM17,auVar267);
        }
        *(undefined1 (*) [64])((long)top_blob->data + uVar102 * 0x40) = in_ZMM16;
        uVar102 = uVar102 + 1;
      } while (uVar102 != uVar103);
    }
  }
  iVar100 = 0;
LAB_002b78ae:
  piVar10 = (int *)CONCAT44(uStack_11c,uStack_120);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_108 == (Allocator *)0x0) {
        if (local_128 != (undefined1 (*) [32])0x0) {
          free(local_128);
        }
      }
      else {
        (*local_108->_vptr_Allocator[3])();
      }
    }
  }
  return iVar100;
}

Assistant:

int InnerProduct_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}